

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  ulong uVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  byte bVar95;
  byte bVar96;
  ulong uVar97;
  uint uVar98;
  uint uVar99;
  long lVar100;
  uint uVar101;
  long lVar102;
  ulong uVar103;
  byte bVar104;
  float fVar105;
  float fVar106;
  float fVar156;
  float fVar158;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar160;
  float fVar163;
  float fVar164;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined4 uVar165;
  undefined8 uVar166;
  vint4 bi_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  vint4 bi_1;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar196;
  float fVar204;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  float fVar205;
  float fVar212;
  float fVar213;
  vint4 ai_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar214;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  vint4 ai_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  vint4 ai;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_960;
  undefined8 uStack_958;
  RTCFilterFunctionNArguments local_948;
  undefined1 (*local_918) [32];
  undefined1 local_910 [16];
  uint local_900;
  undefined4 uStack_8fc;
  undefined8 uStack_8f8;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined8 uStack_818;
  LinearSpace3fa *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined4 local_640;
  int local_63c;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  byte local_5f0;
  float local_5e0 [4];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [64];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar97 = (ulong)(byte)PVar6;
  lVar39 = uVar97 * 0x25;
  fVar205 = *(float *)(prim + lVar39 + 0x12);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar111 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + lVar39 + 6));
  auVar197._0_4_ = fVar205 * auVar111._0_4_;
  auVar197._4_4_ = fVar205 * auVar111._4_4_;
  auVar197._8_4_ = fVar205 * auVar111._8_4_;
  auVar197._12_4_ = fVar205 * auVar111._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar167._0_4_ = fVar205 * auVar110._0_4_;
  auVar167._4_4_ = fVar205 * auVar110._4_4_;
  auVar167._8_4_ = fVar205 * auVar110._8_4_;
  auVar167._12_4_ = fVar205 * auVar110._12_4_;
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar97 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar215._4_4_ = auVar167._0_4_;
  auVar215._0_4_ = auVar167._0_4_;
  auVar215._8_4_ = auVar167._0_4_;
  auVar215._12_4_ = auVar167._0_4_;
  auVar36 = vshufps_avx(auVar167,auVar167,0x55);
  auVar112 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar205 = auVar112._0_4_;
  auVar187._0_4_ = fVar205 * auVar245._0_4_;
  fVar212 = auVar112._4_4_;
  auVar187._4_4_ = fVar212 * auVar245._4_4_;
  fVar213 = auVar112._8_4_;
  auVar187._8_4_ = fVar213 * auVar245._8_4_;
  fVar214 = auVar112._12_4_;
  auVar187._12_4_ = fVar214 * auVar245._12_4_;
  auVar182._0_4_ = auVar32._0_4_ * fVar205;
  auVar182._4_4_ = auVar32._4_4_ * fVar212;
  auVar182._8_4_ = auVar32._8_4_ * fVar213;
  auVar182._12_4_ = auVar32._12_4_ * fVar214;
  auVar168._0_4_ = auVar35._0_4_ * fVar205;
  auVar168._4_4_ = auVar35._4_4_ * fVar212;
  auVar168._8_4_ = auVar35._8_4_ * fVar213;
  auVar168._12_4_ = auVar35._12_4_ * fVar214;
  auVar112 = vfmadd231ps_fma(auVar187,auVar36,auVar110);
  auVar113 = vfmadd231ps_fma(auVar182,auVar36,auVar31);
  auVar36 = vfmadd231ps_fma(auVar168,auVar34,auVar36);
  auVar40 = vfmadd231ps_fma(auVar112,auVar215,auVar111);
  auVar113 = vfmadd231ps_fma(auVar113,auVar215,auVar30);
  auVar41 = vfmadd231ps_fma(auVar36,auVar33,auVar215);
  auVar238._4_4_ = auVar197._0_4_;
  auVar238._0_4_ = auVar197._0_4_;
  auVar238._8_4_ = auVar197._0_4_;
  auVar238._12_4_ = auVar197._0_4_;
  auVar36 = vshufps_avx(auVar197,auVar197,0x55);
  auVar112 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar205 = auVar112._0_4_;
  auVar216._0_4_ = fVar205 * auVar245._0_4_;
  fVar212 = auVar112._4_4_;
  auVar216._4_4_ = fVar212 * auVar245._4_4_;
  fVar213 = auVar112._8_4_;
  auVar216._8_4_ = fVar213 * auVar245._8_4_;
  fVar214 = auVar112._12_4_;
  auVar216._12_4_ = fVar214 * auVar245._12_4_;
  auVar206._0_4_ = auVar32._0_4_ * fVar205;
  auVar206._4_4_ = auVar32._4_4_ * fVar212;
  auVar206._8_4_ = auVar32._8_4_ * fVar213;
  auVar206._12_4_ = auVar32._12_4_ * fVar214;
  auVar198._0_4_ = auVar35._0_4_ * fVar205;
  auVar198._4_4_ = auVar35._4_4_ * fVar212;
  auVar198._8_4_ = auVar35._8_4_ * fVar213;
  auVar198._12_4_ = auVar35._12_4_ * fVar214;
  auVar110 = vfmadd231ps_fma(auVar216,auVar36,auVar110);
  auVar245 = vfmadd231ps_fma(auVar206,auVar36,auVar31);
  auVar31 = vfmadd231ps_fma(auVar198,auVar36,auVar34);
  auVar42 = vfmadd231ps_fma(auVar110,auVar238,auVar111);
  auVar167 = vfmadd231ps_fma(auVar245,auVar238,auVar30);
  auVar229._8_4_ = 0x7fffffff;
  auVar229._0_8_ = 0x7fffffff7fffffff;
  auVar229._12_4_ = 0x7fffffff;
  auVar168 = vfmadd231ps_fma(auVar31,auVar238,auVar33);
  auVar111 = vandps_avx(auVar229,auVar40);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar16 = (bool)((byte)uVar103 & 1);
  auVar107._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar40._0_4_;
  bVar16 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar40._4_4_;
  bVar16 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar40._8_4_;
  bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar40._12_4_;
  auVar111 = vandps_avx(auVar229,auVar113);
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar16 = (bool)((byte)uVar103 & 1);
  auVar108._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar113._0_4_;
  bVar16 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar113._4_4_;
  bVar16 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar113._8_4_;
  bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar113._12_4_;
  auVar111 = vandps_avx(auVar229,auVar41);
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar16 = (bool)((byte)uVar103 & 1);
  auVar109._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar41._0_4_;
  bVar16 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar41._4_4_;
  bVar16 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar41._8_4_;
  bVar16 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar41._12_4_;
  auVar110 = vrcp14ps_avx512vl(auVar107);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = &DAT_3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar111 = vfnmadd213ps_fma(auVar107,auVar110,auVar227);
  auVar40 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar111 = vfnmadd213ps_fma(auVar108,auVar110,auVar227);
  auVar41 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar109);
  auVar111 = vfnmadd213ps_fma(auVar109,auVar110,auVar227);
  auVar114 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  fVar205 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar39 + 0x16)) *
            *(float *)(prim + lVar39 + 0x1a);
  auVar224._4_4_ = fVar205;
  auVar224._0_4_ = fVar205;
  auVar224._8_4_ = fVar205;
  auVar224._12_4_ = fVar205;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar110 = vpmovsxwd_avx(auVar110);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar30 = vsubps_avx(auVar110,auVar111);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar110 = vpmovsxwd_avx(auVar245);
  auVar245 = vfmadd213ps_fma(auVar30,auVar224,auVar111);
  auVar111 = vcvtdq2ps_avx(auVar110);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar110 = vpmovsxwd_avx(auVar30);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar30 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar111 = vpmovsxwd_avx(auVar31);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar103 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar97 * 2 + uVar103 + 6);
  auVar110 = vpmovsxwd_avx(auVar32);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar31 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar111 = vpmovsxwd_avx(auVar33);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar110 = vpmovsxwd_avx(auVar34);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar32 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar111 = vpmovsxwd_avx(auVar35);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar97 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar110 = vpmovsxwd_avx(auVar36);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar33 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar97) + 6);
  auVar111 = vpmovsxwd_avx(auVar112);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar110 = vpmovsxwd_avx(auVar113);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar110 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar111 = vsubps_avx(auVar245,auVar42);
  auVar225._0_4_ = auVar40._0_4_ * auVar111._0_4_;
  auVar225._4_4_ = auVar40._4_4_ * auVar111._4_4_;
  auVar225._8_4_ = auVar40._8_4_ * auVar111._8_4_;
  auVar225._12_4_ = auVar40._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar30,auVar42);
  auVar188._0_4_ = auVar40._0_4_ * auVar111._0_4_;
  auVar188._4_4_ = auVar40._4_4_ * auVar111._4_4_;
  auVar188._8_4_ = auVar40._8_4_ * auVar111._8_4_;
  auVar188._12_4_ = auVar40._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar31,auVar167);
  auVar217._0_4_ = auVar41._0_4_ * auVar111._0_4_;
  auVar217._4_4_ = auVar41._4_4_ * auVar111._4_4_;
  auVar217._8_4_ = auVar41._8_4_ * auVar111._8_4_;
  auVar217._12_4_ = auVar41._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar32,auVar167);
  auVar183._0_4_ = auVar41._0_4_ * auVar111._0_4_;
  auVar183._4_4_ = auVar41._4_4_ * auVar111._4_4_;
  auVar183._8_4_ = auVar41._8_4_ * auVar111._8_4_;
  auVar183._12_4_ = auVar41._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar33,auVar168);
  auVar207._0_4_ = auVar114._0_4_ * auVar111._0_4_;
  auVar207._4_4_ = auVar114._4_4_ * auVar111._4_4_;
  auVar207._8_4_ = auVar114._8_4_ * auVar111._8_4_;
  auVar207._12_4_ = auVar114._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar110,auVar168);
  auVar169._0_4_ = auVar114._0_4_ * auVar111._0_4_;
  auVar169._4_4_ = auVar114._4_4_ * auVar111._4_4_;
  auVar169._8_4_ = auVar114._8_4_ * auVar111._8_4_;
  auVar169._12_4_ = auVar114._12_4_ * auVar111._12_4_;
  auVar111 = vpminsd_avx(auVar225,auVar188);
  auVar110 = vpminsd_avx(auVar217,auVar183);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar110 = vpminsd_avx(auVar207,auVar169);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar40._4_4_ = uVar165;
  auVar40._0_4_ = uVar165;
  auVar40._8_4_ = uVar165;
  auVar40._12_4_ = uVar165;
  auVar110 = vmaxps_avx512vl(auVar110,auVar40);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar41._8_4_ = 0x3f7ffffa;
  auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar41._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar111,auVar41);
  auVar111 = vpmaxsd_avx(auVar225,auVar188);
  auVar110 = vpmaxsd_avx(auVar217,auVar183);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar110 = vpmaxsd_avx(auVar207,auVar169);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar114._4_4_ = uVar165;
  auVar114._0_4_ = uVar165;
  auVar114._8_4_ = uVar165;
  auVar114._12_4_ = uVar165;
  auVar110 = vminps_avx512vl(auVar110,auVar114);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar111 = vmulps_avx512vl(auVar111,auVar42);
  auVar110 = vpbroadcastd_avx512vl();
  uVar166 = vcmpps_avx512vl(local_4b0,auVar111,2);
  uVar103 = vpcmpgtd_avx512vl(auVar110,_DAT_01ff0cf0);
  uVar103 = ((byte)uVar166 & 0xf) & uVar103;
  if ((char)uVar103 != '\0') {
    local_808 = pre->ray_space + k;
    local_918 = (undefined1 (*) [32])local_100;
    auVar181 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar181);
    do {
      lVar39 = 0;
      for (uVar97 = uVar103; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        lVar39 = lVar39 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      uVar8 = *(uint *)(prim + lVar39 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar7].ptr;
      uVar97 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               (ulong)uVar8 *
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar205 = (pGVar11->time_range).lower;
      fVar205 = pGVar11->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar205) /
                ((pGVar11->time_range).upper - fVar205));
      auVar111 = vroundss_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),9);
      auVar111 = vminss_avx(auVar111,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar111 = vmaxss_avx(ZEXT816(0) << 0x20,auVar111);
      fVar205 = fVar205 - auVar111._0_4_;
      fVar212 = 1.0 - fVar205;
      _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar102 = (long)(int)auVar111._0_4_ * 0x38;
      lVar100 = *(long *)(_Var12 + 0x10 + lVar102);
      lVar13 = *(long *)(_Var12 + 0x38 + lVar102);
      lVar14 = *(long *)(_Var12 + 0x48 + lVar102);
      auVar170._4_4_ = fVar205;
      auVar170._0_4_ = fVar205;
      auVar170._8_4_ = fVar205;
      auVar170._12_4_ = fVar205;
      pfVar3 = (float *)(lVar13 + lVar14 * uVar97);
      auVar230._0_4_ = fVar205 * *pfVar3;
      auVar230._4_4_ = fVar205 * pfVar3[1];
      auVar230._8_4_ = fVar205 * pfVar3[2];
      auVar230._12_4_ = fVar205 * pfVar3[3];
      lVar39 = uVar97 + 1;
      auVar111 = vmulps_avx512vl(auVar170,*(undefined1 (*) [16])(lVar13 + lVar14 * lVar39));
      p_Var15 = pGVar11[4].occlusionFilterN;
      auVar184._4_4_ = fVar212;
      auVar184._0_4_ = fVar212;
      auVar184._8_4_ = fVar212;
      auVar184._12_4_ = fVar212;
      auVar30 = vfmadd231ps_fma(auVar230,auVar184,
                                *(undefined1 (*) [16])
                                 (*(long *)(_Var12 + lVar102) + lVar100 * uVar97));
      _local_8d0 = vfmadd231ps_avx512vl
                             (auVar111,auVar184,
                              *(undefined1 (*) [16])(*(long *)(_Var12 + lVar102) + lVar100 * lVar39)
                             );
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar102 + 0x38) +
                        uVar97 * *(long *)(p_Var15 + lVar102 + 0x48));
      auVar231._0_4_ = fVar205 * *pfVar3;
      auVar231._4_4_ = fVar205 * pfVar3[1];
      auVar231._8_4_ = fVar205 * pfVar3[2];
      auVar231._12_4_ = fVar205 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar102 + 0x38) +
                        *(long *)(p_Var15 + lVar102 + 0x48) * lVar39);
      auVar234._0_4_ = fVar205 * *pfVar3;
      auVar234._4_4_ = fVar205 * pfVar3[1];
      auVar234._8_4_ = fVar205 * pfVar3[2];
      auVar234._12_4_ = fVar205 * pfVar3[3];
      auVar110 = vfmadd231ps_fma(auVar231,auVar184,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var15 + lVar102) +
                                  *(long *)(p_Var15 + lVar102 + 0x10) * uVar97));
      auVar245 = vfmadd231ps_fma(auVar234,auVar184,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var15 + lVar102) +
                                  *(long *)(p_Var15 + lVar102 + 0x10) * lVar39));
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar39 = (long)iVar9 * 0x44;
      auVar185._8_4_ = 0xbeaaaaab;
      auVar185._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar185._12_4_ = 0xbeaaaaab;
      local_8e0 = vfnmadd213ps_fma(auVar110,auVar185,auVar30);
      local_8f0 = vfmadd213ps_avx512vl(auVar245,auVar185,_local_8d0);
      auVar245 = vsubps_avx(auVar30,auVar111);
      uVar165 = auVar245._0_4_;
      auVar189._4_4_ = uVar165;
      auVar189._0_4_ = uVar165;
      auVar189._8_4_ = uVar165;
      auVar189._12_4_ = uVar165;
      auVar110 = vshufps_avx(auVar245,auVar245,0x55);
      aVar4 = (local_808->vx).field_0;
      aVar5 = (local_808->vy).field_0;
      fVar205 = (local_808->vz).field_0.m128[0];
      fVar212 = *(float *)((long)&(local_808->vz).field_0 + 4);
      fVar213 = *(float *)((long)&(local_808->vz).field_0 + 8);
      fVar214 = *(float *)((long)&(local_808->vz).field_0 + 0xc);
      auVar245 = vshufps_avx(auVar245,auVar245,0xaa);
      auVar233._0_4_ = fVar205 * auVar245._0_4_;
      auVar233._4_4_ = fVar212 * auVar245._4_4_;
      auVar233._8_4_ = fVar213 * auVar245._8_4_;
      auVar233._12_4_ = fVar214 * auVar245._12_4_;
      auVar110 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar110);
      auVar31 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar189);
      auVar245 = vsubps_avx(local_8e0,auVar111);
      uVar165 = auVar245._0_4_;
      auVar190._4_4_ = uVar165;
      auVar190._0_4_ = uVar165;
      auVar190._8_4_ = uVar165;
      auVar190._12_4_ = uVar165;
      auVar110 = vshufps_avx(auVar245,auVar245,0x55);
      auVar245 = vshufps_avx(auVar245,auVar245,0xaa);
      auVar235._0_4_ = fVar205 * auVar245._0_4_;
      auVar235._4_4_ = fVar212 * auVar245._4_4_;
      auVar235._8_4_ = fVar213 * auVar245._8_4_;
      auVar235._12_4_ = fVar214 * auVar245._12_4_;
      auVar110 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar110);
      auVar32 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar190);
      auVar245 = vsubps_avx(local_8f0,auVar111);
      uVar165 = auVar245._0_4_;
      auVar191._4_4_ = uVar165;
      auVar191._0_4_ = uVar165;
      auVar191._8_4_ = uVar165;
      auVar191._12_4_ = uVar165;
      auVar110 = vshufps_avx(auVar245,auVar245,0x55);
      auVar245 = vshufps_avx(auVar245,auVar245,0xaa);
      auVar236._0_4_ = fVar205 * auVar245._0_4_;
      auVar236._4_4_ = fVar212 * auVar245._4_4_;
      auVar236._8_4_ = fVar213 * auVar245._8_4_;
      auVar236._12_4_ = fVar214 * auVar245._12_4_;
      auVar110 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar110);
      auVar245 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar191);
      auVar110 = vsubps_avx512vl(_local_8d0,auVar111);
      uVar165 = auVar110._0_4_;
      auVar186._4_4_ = uVar165;
      auVar186._0_4_ = uVar165;
      auVar186._8_4_ = uVar165;
      auVar186._12_4_ = uVar165;
      auVar111 = vshufps_avx(auVar110,auVar110,0x55);
      auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
      auVar239._0_4_ = fVar205 * auVar110._0_4_;
      auVar239._4_4_ = fVar212 * auVar110._4_4_;
      auVar239._8_4_ = fVar213 * auVar110._8_4_;
      auVar239._12_4_ = fVar214 * auVar110._12_4_;
      auVar111 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar5,auVar111);
      auVar33 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar4,auVar186);
      auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar39);
      uVar165 = auVar31._0_4_;
      local_760._4_4_ = uVar165;
      local_760._0_4_ = uVar165;
      local_760._8_4_ = uVar165;
      local_760._12_4_ = uVar165;
      local_760._16_4_ = uVar165;
      local_760._20_4_ = uVar165;
      local_760._24_4_ = uVar165;
      local_760._28_4_ = uVar165;
      auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x484);
      auVar115._8_4_ = 1;
      auVar115._0_8_ = 0x100000001;
      auVar115._12_4_ = 1;
      auVar115._16_4_ = 1;
      auVar115._20_4_ = 1;
      auVar115._24_4_ = 1;
      auVar115._28_4_ = 1;
      local_6e0 = vpermps_avx2(auVar115,ZEXT1632(auVar31));
      local_780 = vbroadcastss_avx512vl(auVar32);
      local_700 = vpermps_avx512vl(auVar115,ZEXT1632(auVar32));
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x908);
      local_7a0 = vbroadcastss_avx512vl(auVar245);
      local_7c0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar245));
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0xd8c);
      uVar165 = auVar33._0_4_;
      local_720._4_4_ = uVar165;
      local_720._0_4_ = uVar165;
      local_720._8_4_ = uVar165;
      local_720._12_4_ = uVar165;
      local_720._16_4_ = uVar165;
      local_720._20_4_ = uVar165;
      local_720._24_4_ = uVar165;
      local_720._28_4_ = uVar165;
      local_740 = vpermps_avx2(auVar115,ZEXT1632(auVar33));
      auVar115 = vmulps_avx512vl(local_720,auVar127);
      auVar116 = vmulps_avx512vl(local_740,auVar127);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar128,local_7a0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar128,local_7c0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar132,local_780);
      auVar117 = vfmadd231ps_avx512vl(auVar116,auVar132,local_700);
      auVar118 = vfmadd231ps_avx512vl(auVar115,auVar130,local_760);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar39);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x484);
      auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x908);
      auVar119 = vfmadd231ps_avx512vl(auVar117,auVar130,local_6e0);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0xd8c);
      auVar181 = ZEXT3264(local_720);
      auVar120 = vmulps_avx512vl(local_720,auVar117);
      auVar251 = ZEXT3264(local_740);
      auVar121 = vmulps_avx512vl(local_740,auVar117);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,local_7a0);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_7c0);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_780);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar116,local_700);
      auVar34 = vfmadd231ps_fma(auVar120,auVar115,local_760);
      auVar35 = vfmadd231ps_fma(auVar121,auVar115,local_6e0);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar34),auVar118);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar35),auVar119);
      auVar120 = vmulps_avx512vl(auVar119,auVar121);
      auVar123 = vmulps_avx512vl(auVar118,auVar122);
      auVar120 = vsubps_avx512vl(auVar120,auVar123);
      auVar111 = vshufps_avx(auVar30,auVar30,0xff);
      uVar166 = auVar111._0_8_;
      local_320._8_8_ = uVar166;
      local_320._0_8_ = uVar166;
      local_320._16_8_ = uVar166;
      local_320._24_8_ = uVar166;
      auVar111 = vshufps_avx(local_8e0,local_8e0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar111);
      auVar111 = vshufps_avx(local_8f0,local_8f0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar111);
      auVar111 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar166 = auVar111._0_8_;
      register0x00001248 = uVar166;
      local_380 = uVar166;
      register0x00001250 = uVar166;
      register0x00001258 = uVar166;
      auVar123 = vmulps_avx512vl(_local_380,auVar127);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar128,local_360);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar132,local_340);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,local_320);
      auVar124 = vmulps_avx512vl(_local_380,auVar117);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar126,local_360);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,local_340);
      auVar36 = vfmadd231ps_fma(auVar124,auVar115,local_320);
      auVar124 = vmulps_avx512vl(auVar122,auVar122);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar121,auVar121);
      auVar125 = vmaxps_avx512vl(auVar123,ZEXT1632(auVar36));
      auVar125 = vmulps_avx512vl(auVar125,auVar125);
      auVar124 = vmulps_avx512vl(auVar125,auVar124);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      uVar166 = vcmpps_avx512vl(auVar120,auVar124,2);
      auVar111 = vblendps_avx(auVar31,auVar30,8);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar110 = vandps_avx512vl(auVar111,auVar112);
      auVar111 = vblendps_avx(auVar32,local_8e0,8);
      auVar111 = vandps_avx512vl(auVar111,auVar112);
      auVar110 = vmaxps_avx(auVar110,auVar111);
      auVar111 = vblendps_avx(auVar245,local_8f0,8);
      auVar113 = vandps_avx512vl(auVar111,auVar112);
      auVar111 = vblendps_avx(auVar33,_local_8d0,8);
      auVar111 = vandps_avx512vl(auVar111,auVar112);
      auVar111 = vmaxps_avx(auVar113,auVar111);
      auVar111 = vmaxps_avx(auVar110,auVar111);
      auVar110 = vmovshdup_avx(auVar111);
      auVar110 = vmaxss_avx(auVar110,auVar111);
      auVar111 = vshufpd_avx(auVar111,auVar111,1);
      auVar111 = vmaxss_avx(auVar111,auVar110);
      auVar110 = vcvtsi2ss_avx512f(_local_8d0,iVar9);
      auVar124._0_4_ = auVar110._0_4_;
      auVar124._4_4_ = auVar124._0_4_;
      auVar124._8_4_ = auVar124._0_4_;
      auVar124._12_4_ = auVar124._0_4_;
      auVar124._16_4_ = auVar124._0_4_;
      auVar124._20_4_ = auVar124._0_4_;
      auVar124._24_4_ = auVar124._0_4_;
      auVar124._28_4_ = auVar124._0_4_;
      uVar37 = vcmpps_avx512vl(auVar124,_DAT_02020f40,0xe);
      bVar104 = (byte)uVar166 & (byte)uVar37;
      auVar111 = vmulss_avx512f(auVar111,ZEXT416(0x35000000));
      auVar120._8_4_ = 2;
      auVar120._0_8_ = 0x200000002;
      auVar120._12_4_ = 2;
      auVar120._16_4_ = 2;
      auVar120._20_4_ = 2;
      auVar120._24_4_ = 2;
      auVar120._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar120,ZEXT1632(auVar31));
      local_3c0 = vpermps_avx512vl(auVar120,ZEXT1632(auVar32));
      local_3e0 = vpermps_avx512vl(auVar120,ZEXT1632(auVar245));
      auVar120 = vpermps_avx2(auVar120,ZEXT1632(auVar33));
      uVar101 = *(uint *)(ray + k * 4 + 0xc0);
      auVar110 = local_3c0._0_16_;
      local_960 = auVar30._0_8_;
      uStack_958 = auVar30._8_8_;
      if (bVar104 == 0) {
        auVar110 = vxorps_avx512vl(auVar110,auVar110);
        auVar246 = ZEXT1664(auVar110);
        auVar244 = ZEXT3264(local_760);
        auVar242 = ZEXT3264(local_6e0);
        auVar247 = ZEXT3264(local_780);
        auVar248 = ZEXT3264(local_700);
        auVar249 = ZEXT3264(local_7a0);
        auVar250 = ZEXT3264(local_7c0);
      }
      else {
        local_800._0_16_ = ZEXT416(uVar101);
        auVar117 = vmulps_avx512vl(auVar120,auVar117);
        auVar126 = vfmadd213ps_avx512vl(auVar126,local_3e0,auVar117);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_3c0,auVar126);
        auVar125 = vfmadd213ps_avx512vl(auVar115,local_3a0,auVar116);
        auVar127 = vmulps_avx512vl(auVar120,auVar127);
        auVar128 = vfmadd213ps_avx512vl(auVar128,local_3e0,auVar127);
        auVar116 = vfmadd213ps_avx512vl(auVar132,local_3c0,auVar128);
        auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1694);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar39 + 0x1f9c);
        auVar129 = vfmadd213ps_avx512vl(auVar130,local_3a0,auVar116);
        auVar130 = vmulps_avx512vl(local_720,auVar115);
        auVar116 = vmulps_avx512vl(local_740,auVar115);
        auVar237._0_4_ = auVar120._0_4_ * auVar115._0_4_;
        auVar237._4_4_ = auVar120._4_4_ * auVar115._4_4_;
        auVar237._8_4_ = auVar120._8_4_ * auVar115._8_4_;
        auVar237._12_4_ = auVar120._12_4_ * auVar115._12_4_;
        auVar237._16_4_ = auVar120._16_4_ * auVar115._16_4_;
        auVar237._20_4_ = auVar120._20_4_ * auVar115._20_4_;
        auVar237._24_4_ = auVar120._24_4_ * auVar115._24_4_;
        auVar237._28_4_ = 0;
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,local_7a0);
        auVar115 = vfmadd231ps_avx512vl(auVar116,auVar127,local_7c0);
        auVar127 = vfmadd231ps_avx512vl(auVar237,local_3e0,auVar127);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar128,local_780);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar128,local_700);
        auVar116 = vfmadd231ps_avx512vl(auVar127,local_3c0,auVar128);
        auVar126 = vfmadd231ps_avx512vl(auVar130,auVar132,local_760);
        auVar242 = ZEXT3264(local_6e0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar132,local_6e0);
        auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1b18);
        auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1f9c);
        auVar116 = vfmadd231ps_avx512vl(auVar116,local_3a0,auVar132);
        auVar117 = vmulps_avx512vl(local_720,auVar127);
        auVar131 = vmulps_avx512vl(local_740,auVar127);
        auVar132._4_4_ = auVar120._4_4_ * auVar127._4_4_;
        auVar132._0_4_ = auVar120._0_4_ * auVar127._0_4_;
        auVar132._8_4_ = auVar120._8_4_ * auVar127._8_4_;
        auVar132._12_4_ = auVar120._12_4_ * auVar127._12_4_;
        auVar132._16_4_ = auVar120._16_4_ * auVar127._16_4_;
        auVar132._20_4_ = auVar120._20_4_ * auVar127._20_4_;
        auVar132._24_4_ = auVar120._24_4_ * auVar127._24_4_;
        auVar132._28_4_ = auVar127._28_4_;
        auVar127 = vfmadd231ps_avx512vl(auVar117,auVar128,local_7a0);
        auVar117 = vfmadd231ps_avx512vl(auVar131,auVar128,local_7c0);
        auVar128 = vfmadd231ps_avx512vl(auVar132,local_3e0,auVar128);
        auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar39 + 0x1694);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar132,local_780);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar132,local_700);
        auVar132 = vfmadd231ps_avx512vl(auVar128,local_3c0,auVar132);
        auVar128 = vfmadd231ps_avx512vl(auVar127,auVar130,local_760);
        auVar127 = vfmadd231ps_avx512vl(auVar117,auVar130,local_6e0);
        auVar117 = vfmadd231ps_avx512vl(auVar132,local_3a0,auVar130);
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar130 = vandps_avx(auVar126,auVar240);
        auVar132 = vandps_avx(auVar115,auVar240);
        auVar132 = vmaxps_avx(auVar130,auVar132);
        auVar130 = vandps_avx(auVar116,auVar240);
        auVar130 = vmaxps_avx(auVar132,auVar130);
        auVar116 = vbroadcastss_avx512vl(auVar111);
        auVar252 = ZEXT1664(auVar111);
        uVar97 = vcmpps_avx512vl(auVar130,auVar116,1);
        bVar16 = (bool)((byte)uVar97 & 1);
        auVar131._0_4_ = (float)((uint)bVar16 * auVar121._0_4_ | (uint)!bVar16 * auVar126._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar16 * auVar121._4_4_ | (uint)!bVar16 * auVar126._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar16 * auVar121._8_4_ | (uint)!bVar16 * auVar126._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar16 * auVar121._12_4_ | (uint)!bVar16 * auVar126._12_4_);
        bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar16 * auVar121._16_4_ | (uint)!bVar16 * auVar126._16_4_);
        bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar16 * auVar121._20_4_ | (uint)!bVar16 * auVar126._20_4_);
        bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar16 * auVar121._24_4_ | (uint)!bVar16 * auVar126._24_4_);
        bVar16 = SUB81(uVar97 >> 7,0);
        auVar131._28_4_ = (uint)bVar16 * auVar121._28_4_ | (uint)!bVar16 * auVar126._28_4_;
        bVar16 = (bool)((byte)uVar97 & 1);
        auVar133._0_4_ = (float)((uint)bVar16 * auVar122._0_4_ | (uint)!bVar16 * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar133._16_4_ = (float)((uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar133._20_4_ = (float)((uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar133._24_4_ = (float)((uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar97 >> 7,0);
        auVar133._28_4_ = (uint)bVar16 * auVar122._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        auVar130 = vandps_avx(auVar240,auVar128);
        auVar132 = vandps_avx(auVar127,auVar240);
        auVar132 = vmaxps_avx(auVar130,auVar132);
        auVar130 = vandps_avx(auVar117,auVar240);
        auVar130 = vmaxps_avx(auVar132,auVar130);
        uVar97 = vcmpps_avx512vl(auVar130,auVar116,1);
        bVar16 = (bool)((byte)uVar97 & 1);
        auVar134._0_4_ = (float)((uint)bVar16 * auVar121._0_4_ | (uint)!bVar16 * auVar128._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar16 * auVar121._4_4_ | (uint)!bVar16 * auVar128._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar16 * auVar121._8_4_ | (uint)!bVar16 * auVar128._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar16 * auVar121._12_4_ | (uint)!bVar16 * auVar128._12_4_);
        bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar16 * auVar121._16_4_ | (uint)!bVar16 * auVar128._16_4_);
        bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar16 * auVar121._20_4_ | (uint)!bVar16 * auVar128._20_4_);
        bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar16 * auVar121._24_4_ | (uint)!bVar16 * auVar128._24_4_);
        bVar16 = SUB81(uVar97 >> 7,0);
        auVar134._28_4_ = (uint)bVar16 * auVar121._28_4_ | (uint)!bVar16 * auVar128._28_4_;
        bVar16 = (bool)((byte)uVar97 & 1);
        auVar135._0_4_ = (float)((uint)bVar16 * auVar122._0_4_ | (uint)!bVar16 * auVar127._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar127._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar127._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar127._12_4_);
        bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar127._16_4_);
        bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar127._20_4_);
        bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar127._24_4_);
        bVar16 = SUB81(uVar97 >> 7,0);
        auVar135._28_4_ = (uint)bVar16 * auVar122._28_4_ | (uint)!bVar16 * auVar127._28_4_;
        auVar114 = vxorps_avx512vl(auVar110,auVar110);
        auVar246 = ZEXT1664(auVar114);
        auVar130 = vfmadd213ps_avx512vl(auVar131,auVar131,ZEXT1632(auVar114));
        auVar110 = vfmadd231ps_fma(auVar130,auVar133,auVar133);
        auVar132 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
        fVar205 = auVar132._0_4_;
        fVar212 = auVar132._4_4_;
        fVar213 = auVar132._8_4_;
        fVar214 = auVar132._12_4_;
        fVar196 = auVar132._16_4_;
        fVar204 = auVar132._20_4_;
        fVar105 = auVar132._24_4_;
        auVar130._4_4_ = fVar212 * fVar212 * fVar212 * auVar110._4_4_ * -0.5;
        auVar130._0_4_ = fVar205 * fVar205 * fVar205 * auVar110._0_4_ * -0.5;
        auVar130._8_4_ = fVar213 * fVar213 * fVar213 * auVar110._8_4_ * -0.5;
        auVar130._12_4_ = fVar214 * fVar214 * fVar214 * auVar110._12_4_ * -0.5;
        auVar130._16_4_ = fVar196 * fVar196 * fVar196 * -0.0;
        auVar130._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
        auVar130._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar130._28_4_ = auVar117._28_4_;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar115,auVar132);
        auVar128._4_4_ = auVar133._4_4_ * auVar130._4_4_;
        auVar128._0_4_ = auVar133._0_4_ * auVar130._0_4_;
        auVar128._8_4_ = auVar133._8_4_ * auVar130._8_4_;
        auVar128._12_4_ = auVar133._12_4_ * auVar130._12_4_;
        auVar128._16_4_ = auVar133._16_4_ * auVar130._16_4_;
        auVar128._20_4_ = auVar133._20_4_ * auVar130._20_4_;
        auVar128._24_4_ = auVar133._24_4_ * auVar130._24_4_;
        auVar128._28_4_ = 0;
        auVar127._4_4_ = auVar130._4_4_ * -auVar131._4_4_;
        auVar127._0_4_ = auVar130._0_4_ * -auVar131._0_4_;
        auVar127._8_4_ = auVar130._8_4_ * -auVar131._8_4_;
        auVar127._12_4_ = auVar130._12_4_ * -auVar131._12_4_;
        auVar127._16_4_ = auVar130._16_4_ * -auVar131._16_4_;
        auVar127._20_4_ = auVar130._20_4_ * -auVar131._20_4_;
        auVar127._24_4_ = auVar130._24_4_ * -auVar131._24_4_;
        auVar127._28_4_ = auVar133._28_4_;
        auVar130 = vmulps_avx512vl(auVar130,ZEXT1632(auVar114));
        auVar121 = ZEXT1632(auVar114);
        auVar132 = vfmadd213ps_avx512vl(auVar134,auVar134,auVar121);
        auVar110 = vfmadd231ps_fma(auVar132,auVar135,auVar135);
        auVar132 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
        fVar205 = auVar132._0_4_;
        fVar212 = auVar132._4_4_;
        fVar213 = auVar132._8_4_;
        fVar214 = auVar132._12_4_;
        fVar196 = auVar132._16_4_;
        fVar204 = auVar132._20_4_;
        fVar105 = auVar132._24_4_;
        auVar116._4_4_ = fVar212 * fVar212 * fVar212 * auVar110._4_4_ * -0.5;
        auVar116._0_4_ = fVar205 * fVar205 * fVar205 * auVar110._0_4_ * -0.5;
        auVar116._8_4_ = fVar213 * fVar213 * fVar213 * auVar110._8_4_ * -0.5;
        auVar116._12_4_ = fVar214 * fVar214 * fVar214 * auVar110._12_4_ * -0.5;
        auVar116._16_4_ = fVar196 * fVar196 * fVar196 * -0.0;
        auVar116._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
        auVar116._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar116._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar132);
        auVar126._4_4_ = auVar135._4_4_ * auVar115._4_4_;
        auVar126._0_4_ = auVar135._0_4_ * auVar115._0_4_;
        auVar126._8_4_ = auVar135._8_4_ * auVar115._8_4_;
        auVar126._12_4_ = auVar135._12_4_ * auVar115._12_4_;
        auVar126._16_4_ = auVar135._16_4_ * auVar115._16_4_;
        auVar126._20_4_ = auVar135._20_4_ * auVar115._20_4_;
        auVar126._24_4_ = auVar135._24_4_ * auVar115._24_4_;
        auVar126._28_4_ = auVar132._28_4_;
        auVar117._4_4_ = -auVar134._4_4_ * auVar115._4_4_;
        auVar117._0_4_ = -auVar134._0_4_ * auVar115._0_4_;
        auVar117._8_4_ = -auVar134._8_4_ * auVar115._8_4_;
        auVar117._12_4_ = -auVar134._12_4_ * auVar115._12_4_;
        auVar117._16_4_ = -auVar134._16_4_ * auVar115._16_4_;
        auVar117._20_4_ = -auVar134._20_4_ * auVar115._20_4_;
        auVar117._24_4_ = -auVar134._24_4_ * auVar115._24_4_;
        auVar117._28_4_ = auVar134._28_4_ ^ 0x80000000;
        auVar132 = vmulps_avx512vl(auVar115,auVar121);
        auVar110 = vfmadd213ps_fma(auVar128,auVar123,auVar118);
        auVar245 = vfmadd213ps_fma(auVar127,auVar123,auVar119);
        auVar115 = vfmadd213ps_avx512vl(auVar130,auVar123,auVar129);
        auVar116 = vfmadd213ps_avx512vl(auVar126,ZEXT1632(auVar36),ZEXT1632(auVar34));
        auVar112 = vfnmadd213ps_fma(auVar128,auVar123,auVar118);
        auVar118 = ZEXT1632(auVar36);
        auVar31 = vfmadd213ps_fma(auVar117,auVar118,ZEXT1632(auVar35));
        auVar113 = vfnmadd213ps_fma(auVar127,auVar123,auVar119);
        auVar32 = vfmadd213ps_fma(auVar132,auVar118,auVar125);
        auVar128 = vfnmadd231ps_avx512vl(auVar129,auVar123,auVar130);
        auVar40 = vfnmadd213ps_fma(auVar126,auVar118,ZEXT1632(auVar34));
        auVar35 = vfnmadd213ps_fma(auVar117,auVar118,ZEXT1632(auVar35));
        auVar41 = vfnmadd231ps_fma(auVar125,ZEXT1632(auVar36),auVar132);
        auVar132 = vsubps_avx512vl(auVar116,ZEXT1632(auVar112));
        auVar130 = vsubps_avx(ZEXT1632(auVar31),ZEXT1632(auVar113));
        auVar127 = vsubps_avx512vl(ZEXT1632(auVar32),auVar128);
        auVar126 = vmulps_avx512vl(auVar130,auVar128);
        auVar33 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar113),auVar127);
        auVar118._4_4_ = auVar112._4_4_ * auVar127._4_4_;
        auVar118._0_4_ = auVar112._0_4_ * auVar127._0_4_;
        auVar118._8_4_ = auVar112._8_4_ * auVar127._8_4_;
        auVar118._12_4_ = auVar112._12_4_ * auVar127._12_4_;
        auVar118._16_4_ = auVar127._16_4_ * 0.0;
        auVar118._20_4_ = auVar127._20_4_ * 0.0;
        auVar118._24_4_ = auVar127._24_4_ * 0.0;
        auVar118._28_4_ = auVar127._28_4_;
        auVar127 = vfmsub231ps_avx512vl(auVar118,auVar128,auVar132);
        auVar119._4_4_ = auVar113._4_4_ * auVar132._4_4_;
        auVar119._0_4_ = auVar113._0_4_ * auVar132._0_4_;
        auVar119._8_4_ = auVar113._8_4_ * auVar132._8_4_;
        auVar119._12_4_ = auVar113._12_4_ * auVar132._12_4_;
        auVar119._16_4_ = auVar132._16_4_ * 0.0;
        auVar119._20_4_ = auVar132._20_4_ * 0.0;
        auVar119._24_4_ = auVar132._24_4_ * 0.0;
        auVar119._28_4_ = auVar132._28_4_;
        auVar34 = vfmsub231ps_fma(auVar119,ZEXT1632(auVar112),auVar130);
        auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar34),auVar121,auVar127);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar121,ZEXT1632(auVar33));
        auVar131 = ZEXT1632(auVar114);
        uVar97 = vcmpps_avx512vl(auVar130,auVar131,2);
        bVar96 = (byte)uVar97;
        fVar105 = (float)((uint)(bVar96 & 1) * auVar110._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar40._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar156 = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar40._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar158 = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar40._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar161 = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar40._12_4_);
        auVar126 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar158,CONCAT44(fVar156,fVar105))));
        fVar106 = (float)((uint)(bVar96 & 1) * auVar245._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar35._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar157 = (float)((uint)bVar16 * auVar245._4_4_ | (uint)!bVar16 * auVar35._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar159 = (float)((uint)bVar16 * auVar245._8_4_ | (uint)!bVar16 * auVar35._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar162 = (float)((uint)bVar16 * auVar245._12_4_ | (uint)!bVar16 * auVar35._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar159,CONCAT44(fVar157,fVar106))));
        auVar129._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar41._0_4_
                    );
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * auVar41._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * auVar41._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * auVar41._12_4_);
        fVar212 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar115._16_4_);
        auVar129._16_4_ = fVar212;
        fVar205 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar115._20_4_);
        auVar129._20_4_ = fVar205;
        fVar213 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar115._24_4_);
        auVar129._24_4_ = fVar213;
        iVar1 = (uint)(byte)(uVar97 >> 7) * auVar115._28_4_;
        auVar129._28_4_ = iVar1;
        auVar132 = vblendmps_avx512vl(ZEXT1632(auVar112),auVar116);
        auVar136._0_4_ =
             (uint)(bVar96 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar33._0_4_;
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar16 * auVar132._4_4_ | (uint)!bVar16 * auVar33._4_4_;
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar16 * auVar132._8_4_ | (uint)!bVar16 * auVar33._8_4_;
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar16 * auVar132._12_4_ | (uint)!bVar16 * auVar33._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
        auVar136._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar132._28_4_;
        auVar132 = vblendmps_avx512vl(ZEXT1632(auVar113),ZEXT1632(auVar31));
        auVar137._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar132._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar245._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar16 * auVar132._4_4_ | (uint)!bVar16 * auVar245._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar16 * auVar132._8_4_ | (uint)!bVar16 * auVar245._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar16 * auVar132._12_4_ | (uint)!bVar16 * auVar245._12_4_);
        fVar214 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_);
        auVar137._16_4_ = fVar214;
        fVar196 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_);
        auVar137._20_4_ = fVar196;
        fVar204 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_);
        auVar137._24_4_ = fVar204;
        auVar137._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar132._28_4_;
        auVar132 = vblendmps_avx512vl(auVar128,ZEXT1632(auVar32));
        auVar138._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar132._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar16 * auVar132._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar16 * auVar132._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar16 * auVar132._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar16 * auVar132._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar16 * auVar132._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar16 * auVar132._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar97 >> 7,0);
        auVar138._28_4_ = (uint)bVar16 * auVar132._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        auVar139._0_4_ =
             (uint)(bVar96 & 1) * (int)auVar112._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar116._0_4_;
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar16 * (int)auVar112._4_4_ | (uint)!bVar16 * auVar116._4_4_;
        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar16 * (int)auVar112._8_4_ | (uint)!bVar16 * auVar116._8_4_;
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar16 * (int)auVar112._12_4_ | (uint)!bVar16 * auVar116._12_4_;
        auVar139._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar116._16_4_;
        auVar139._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar116._20_4_;
        auVar139._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar116._24_4_;
        auVar139._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar116._28_4_;
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar140._0_4_ =
             (uint)(bVar96 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar32._0_4_;
        bVar17 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * auVar32._4_4_;
        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * auVar32._8_4_;
        bVar17 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * auVar32._12_4_;
        auVar140._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar128._16_4_;
        auVar140._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar128._20_4_;
        auVar140._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar128._24_4_;
        iVar2 = (uint)(byte)(uVar97 >> 7) * auVar128._28_4_;
        auVar140._28_4_ = iVar2;
        auVar118 = vsubps_avx512vl(auVar139,auVar126);
        auVar132 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar113._12_4_ |
                                                 (uint)!bVar19 * auVar31._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar113._8_4_ |
                                                          (uint)!bVar18 * auVar31._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar113._4_4_ |
                                                                   (uint)!bVar16 * auVar31._4_4_,
                                                                   (uint)(bVar96 & 1) *
                                                                   (int)auVar113._0_4_ |
                                                                   (uint)!(bool)(bVar96 & 1) *
                                                                   auVar31._0_4_)))),auVar117);
        auVar128 = vsubps_avx(auVar140,auVar129);
        auVar127 = vsubps_avx(auVar126,auVar136);
        auVar115 = vsubps_avx(auVar117,auVar137);
        auVar116 = vsubps_avx(auVar129,auVar138);
        auVar121._4_4_ = auVar128._4_4_ * fVar156;
        auVar121._0_4_ = auVar128._0_4_ * fVar105;
        auVar121._8_4_ = auVar128._8_4_ * fVar158;
        auVar121._12_4_ = auVar128._12_4_ * fVar161;
        auVar121._16_4_ = auVar128._16_4_ * 0.0;
        auVar121._20_4_ = auVar128._20_4_ * 0.0;
        auVar121._24_4_ = auVar128._24_4_ * 0.0;
        auVar121._28_4_ = iVar2;
        auVar110 = vfmsub231ps_fma(auVar121,auVar129,auVar118);
        auVar122._4_4_ = fVar157 * auVar118._4_4_;
        auVar122._0_4_ = fVar106 * auVar118._0_4_;
        auVar122._8_4_ = fVar159 * auVar118._8_4_;
        auVar122._12_4_ = fVar162 * auVar118._12_4_;
        auVar122._16_4_ = auVar118._16_4_ * 0.0;
        auVar122._20_4_ = auVar118._20_4_ * 0.0;
        auVar122._24_4_ = auVar118._24_4_ * 0.0;
        auVar122._28_4_ = auVar130._28_4_;
        auVar245 = vfmsub231ps_fma(auVar122,auVar126,auVar132);
        auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar245),auVar131,ZEXT1632(auVar110));
        auVar208._0_4_ = auVar132._0_4_ * auVar129._0_4_;
        auVar208._4_4_ = auVar132._4_4_ * auVar129._4_4_;
        auVar208._8_4_ = auVar132._8_4_ * auVar129._8_4_;
        auVar208._12_4_ = auVar132._12_4_ * auVar129._12_4_;
        auVar208._16_4_ = auVar132._16_4_ * fVar212;
        auVar208._20_4_ = auVar132._20_4_ * fVar205;
        auVar208._24_4_ = auVar132._24_4_ * fVar213;
        auVar208._28_4_ = 0;
        auVar110 = vfmsub231ps_fma(auVar208,auVar117,auVar128);
        auVar119 = vfmadd231ps_avx512vl(auVar130,auVar131,ZEXT1632(auVar110));
        auVar130 = vmulps_avx512vl(auVar116,auVar136);
        auVar130 = vfmsub231ps_avx512vl(auVar130,auVar127,auVar138);
        auVar125._4_4_ = auVar115._4_4_ * auVar138._4_4_;
        auVar125._0_4_ = auVar115._0_4_ * auVar138._0_4_;
        auVar125._8_4_ = auVar115._8_4_ * auVar138._8_4_;
        auVar125._12_4_ = auVar115._12_4_ * auVar138._12_4_;
        auVar125._16_4_ = auVar115._16_4_ * auVar138._16_4_;
        auVar125._20_4_ = auVar115._20_4_ * auVar138._20_4_;
        auVar125._24_4_ = auVar115._24_4_ * auVar138._24_4_;
        auVar125._28_4_ = auVar138._28_4_;
        auVar110 = vfmsub231ps_fma(auVar125,auVar137,auVar116);
        auVar209._0_4_ = auVar137._0_4_ * auVar127._0_4_;
        auVar209._4_4_ = auVar137._4_4_ * auVar127._4_4_;
        auVar209._8_4_ = auVar137._8_4_ * auVar127._8_4_;
        auVar209._12_4_ = auVar137._12_4_ * auVar127._12_4_;
        auVar209._16_4_ = fVar214 * auVar127._16_4_;
        auVar209._20_4_ = fVar196 * auVar127._20_4_;
        auVar209._24_4_ = fVar204 * auVar127._24_4_;
        auVar209._28_4_ = 0;
        auVar245 = vfmsub231ps_fma(auVar209,auVar115,auVar136);
        auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar245),auVar131,auVar130);
        auVar121 = vfmadd231ps_avx512vl(auVar130,auVar131,ZEXT1632(auVar110));
        auVar130 = vmaxps_avx(auVar119,auVar121);
        uVar166 = vcmpps_avx512vl(auVar130,auVar131,2);
        bVar104 = bVar104 & (byte)uVar166;
        auVar244 = ZEXT3264(local_760);
        auVar247 = ZEXT3264(local_780);
        auVar248 = ZEXT3264(local_700);
        auVar249 = ZEXT3264(local_7a0);
        auVar250 = ZEXT3264(local_7c0);
        auVar181 = ZEXT3264(local_720);
        if (bVar104 == 0) {
          bVar104 = 0;
        }
        else {
          auVar53._4_4_ = auVar116._4_4_ * auVar132._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * auVar132._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * auVar132._8_4_;
          auVar53._12_4_ = auVar116._12_4_ * auVar132._12_4_;
          auVar53._16_4_ = auVar116._16_4_ * auVar132._16_4_;
          auVar53._20_4_ = auVar116._20_4_ * auVar132._20_4_;
          auVar53._24_4_ = auVar116._24_4_ * auVar132._24_4_;
          auVar53._28_4_ = auVar130._28_4_;
          auVar31 = vfmsub231ps_fma(auVar53,auVar115,auVar128);
          auVar54._4_4_ = auVar128._4_4_ * auVar127._4_4_;
          auVar54._0_4_ = auVar128._0_4_ * auVar127._0_4_;
          auVar54._8_4_ = auVar128._8_4_ * auVar127._8_4_;
          auVar54._12_4_ = auVar128._12_4_ * auVar127._12_4_;
          auVar54._16_4_ = auVar128._16_4_ * auVar127._16_4_;
          auVar54._20_4_ = auVar128._20_4_ * auVar127._20_4_;
          auVar54._24_4_ = auVar128._24_4_ * auVar127._24_4_;
          auVar54._28_4_ = auVar128._28_4_;
          auVar245 = vfmsub231ps_fma(auVar54,auVar118,auVar116);
          auVar55._4_4_ = auVar115._4_4_ * auVar118._4_4_;
          auVar55._0_4_ = auVar115._0_4_ * auVar118._0_4_;
          auVar55._8_4_ = auVar115._8_4_ * auVar118._8_4_;
          auVar55._12_4_ = auVar115._12_4_ * auVar118._12_4_;
          auVar55._16_4_ = auVar115._16_4_ * auVar118._16_4_;
          auVar55._20_4_ = auVar115._20_4_ * auVar118._20_4_;
          auVar55._24_4_ = auVar115._24_4_ * auVar118._24_4_;
          auVar55._28_4_ = auVar115._28_4_;
          auVar32 = vfmsub231ps_fma(auVar55,auVar127,auVar132);
          auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar245),ZEXT1632(auVar32));
          auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),ZEXT1632(auVar31),auVar131);
          auVar132 = vrcp14ps_avx512vl(auVar130);
          auVar44._8_4_ = 0x3f800000;
          auVar44._0_8_ = &DAT_3f8000003f800000;
          auVar44._12_4_ = 0x3f800000;
          auVar44._16_4_ = 0x3f800000;
          auVar44._20_4_ = 0x3f800000;
          auVar44._24_4_ = 0x3f800000;
          auVar44._28_4_ = 0x3f800000;
          auVar128 = vfnmadd213ps_avx512vl(auVar132,auVar130,auVar44);
          auVar110 = vfmadd132ps_fma(auVar128,auVar132,auVar132);
          auVar56._4_4_ = auVar32._4_4_ * auVar129._4_4_;
          auVar56._0_4_ = auVar32._0_4_ * auVar129._0_4_;
          auVar56._8_4_ = auVar32._8_4_ * auVar129._8_4_;
          auVar56._12_4_ = auVar32._12_4_ * auVar129._12_4_;
          auVar56._16_4_ = fVar212 * 0.0;
          auVar56._20_4_ = fVar205 * 0.0;
          auVar56._24_4_ = fVar213 * 0.0;
          auVar56._28_4_ = iVar1;
          auVar245 = vfmadd231ps_fma(auVar56,auVar117,ZEXT1632(auVar245));
          auVar245 = vfmadd231ps_fma(ZEXT1632(auVar245),auVar126,ZEXT1632(auVar31));
          fVar205 = auVar110._0_4_;
          fVar212 = auVar110._4_4_;
          fVar213 = auVar110._8_4_;
          fVar214 = auVar110._12_4_;
          auVar132 = ZEXT1632(CONCAT412(auVar245._12_4_ * fVar214,
                                        CONCAT48(auVar245._8_4_ * fVar213,
                                                 CONCAT44(auVar245._4_4_ * fVar212,
                                                          auVar245._0_4_ * fVar205))));
          auVar228._4_4_ = uVar101;
          auVar228._0_4_ = uVar101;
          auVar228._8_4_ = uVar101;
          auVar228._12_4_ = uVar101;
          auVar228._16_4_ = uVar101;
          auVar228._20_4_ = uVar101;
          auVar228._24_4_ = uVar101;
          auVar228._28_4_ = uVar101;
          uVar166 = vcmpps_avx512vl(auVar228,auVar132,2);
          uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar45._4_4_ = uVar165;
          auVar45._0_4_ = uVar165;
          auVar45._8_4_ = uVar165;
          auVar45._12_4_ = uVar165;
          auVar45._16_4_ = uVar165;
          auVar45._20_4_ = uVar165;
          auVar45._24_4_ = uVar165;
          auVar45._28_4_ = uVar165;
          uVar37 = vcmpps_avx512vl(auVar132,auVar45,2);
          bVar104 = (byte)uVar166 & (byte)uVar37 & bVar104;
          if (bVar104 != 0) {
            uVar166 = vcmpps_avx512vl(auVar130,auVar131,4);
            if ((bVar104 & (byte)uVar166) != 0) {
              bVar104 = bVar104 & (byte)uVar166;
              fVar196 = auVar119._0_4_ * fVar205;
              fVar204 = auVar119._4_4_ * fVar212;
              auVar57._4_4_ = fVar204;
              auVar57._0_4_ = fVar196;
              fVar105 = auVar119._8_4_ * fVar213;
              auVar57._8_4_ = fVar105;
              fVar106 = auVar119._12_4_ * fVar214;
              auVar57._12_4_ = fVar106;
              fVar156 = auVar119._16_4_ * 0.0;
              auVar57._16_4_ = fVar156;
              fVar157 = auVar119._20_4_ * 0.0;
              auVar57._20_4_ = fVar157;
              fVar158 = auVar119._24_4_ * 0.0;
              auVar57._24_4_ = fVar158;
              auVar57._28_4_ = auVar119._28_4_;
              fVar205 = auVar121._0_4_ * fVar205;
              fVar212 = auVar121._4_4_ * fVar212;
              auVar58._4_4_ = fVar212;
              auVar58._0_4_ = fVar205;
              fVar213 = auVar121._8_4_ * fVar213;
              auVar58._8_4_ = fVar213;
              fVar214 = auVar121._12_4_ * fVar214;
              auVar58._12_4_ = fVar214;
              fVar159 = auVar121._16_4_ * 0.0;
              auVar58._16_4_ = fVar159;
              fVar161 = auVar121._20_4_ * 0.0;
              auVar58._20_4_ = fVar161;
              fVar162 = auVar121._24_4_ * 0.0;
              auVar58._24_4_ = fVar162;
              auVar58._28_4_ = auVar121._28_4_;
              auVar222._8_4_ = 0x3f800000;
              auVar222._0_8_ = &DAT_3f8000003f800000;
              auVar222._12_4_ = 0x3f800000;
              auVar222._16_4_ = 0x3f800000;
              auVar222._20_4_ = 0x3f800000;
              auVar222._24_4_ = 0x3f800000;
              auVar222._28_4_ = 0x3f800000;
              auVar130 = vsubps_avx(auVar222,auVar57);
              local_860._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar196 | (uint)!(bool)(bVar96 & 1) * auVar130._0_4_;
              bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
              local_860._4_4_ = (uint)bVar16 * (int)fVar204 | (uint)!bVar16 * auVar130._4_4_;
              bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
              local_860._8_4_ = (uint)bVar16 * (int)fVar105 | (uint)!bVar16 * auVar130._8_4_;
              bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
              local_860._12_4_ = (uint)bVar16 * (int)fVar106 | (uint)!bVar16 * auVar130._12_4_;
              bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
              local_860._16_4_ = (uint)bVar16 * (int)fVar156 | (uint)!bVar16 * auVar130._16_4_;
              bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
              local_860._20_4_ = (uint)bVar16 * (int)fVar157 | (uint)!bVar16 * auVar130._20_4_;
              bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
              local_860._24_4_ = (uint)bVar16 * (int)fVar158 | (uint)!bVar16 * auVar130._24_4_;
              bVar16 = SUB81(uVar97 >> 7,0);
              local_860._28_4_ = (uint)bVar16 * auVar119._28_4_ | (uint)!bVar16 * auVar130._28_4_;
              auVar130 = vsubps_avx(auVar222,auVar58);
              local_4e0._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar205 | (uint)!(bool)(bVar96 & 1) * auVar130._0_4_;
              bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
              local_4e0._4_4_ = (uint)bVar16 * (int)fVar212 | (uint)!bVar16 * auVar130._4_4_;
              bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
              local_4e0._8_4_ = (uint)bVar16 * (int)fVar213 | (uint)!bVar16 * auVar130._8_4_;
              bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
              local_4e0._12_4_ = (uint)bVar16 * (int)fVar214 | (uint)!bVar16 * auVar130._12_4_;
              bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
              local_4e0._16_4_ = (uint)bVar16 * (int)fVar159 | (uint)!bVar16 * auVar130._16_4_;
              bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
              local_4e0._20_4_ = (uint)bVar16 * (int)fVar161 | (uint)!bVar16 * auVar130._20_4_;
              bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
              local_4e0._24_4_ = (uint)bVar16 * (int)fVar162 | (uint)!bVar16 * auVar130._24_4_;
              bVar16 = SUB81(uVar97 >> 7,0);
              local_4e0._28_4_ = (uint)bVar16 * auVar121._28_4_ | (uint)!bVar16 * auVar130._28_4_;
              local_880 = auVar132;
              goto LAB_01c8a580;
            }
          }
          bVar104 = 0;
        }
LAB_01c8a580:
        auVar243 = ZEXT3264(auVar120);
        if (bVar104 != 0) {
          auVar130 = vsubps_avx(ZEXT1632(auVar36),auVar123);
          auVar110 = vfmadd213ps_fma(auVar130,local_860,auVar123);
          uVar165 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar123._4_4_ = uVar165;
          auVar123._0_4_ = uVar165;
          auVar123._8_4_ = uVar165;
          auVar123._12_4_ = uVar165;
          auVar123._16_4_ = uVar165;
          auVar123._20_4_ = uVar165;
          auVar123._24_4_ = uVar165;
          auVar123._28_4_ = uVar165;
          auVar130 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar110._12_4_ + auVar110._12_4_,
                                                        CONCAT48(auVar110._8_4_ + auVar110._8_4_,
                                                                 CONCAT44(auVar110._4_4_ +
                                                                          auVar110._4_4_,
                                                                          auVar110._0_4_ +
                                                                          auVar110._0_4_)))),
                                     auVar123);
          uVar166 = vcmpps_avx512vl(local_880,auVar130,6);
          bVar104 = bVar104 & (byte)uVar166;
          if (bVar104 != 0) {
            auVar175._8_4_ = 0xbf800000;
            auVar175._0_8_ = 0xbf800000bf800000;
            auVar175._12_4_ = 0xbf800000;
            auVar175._16_4_ = 0xbf800000;
            auVar175._20_4_ = 0xbf800000;
            auVar175._24_4_ = 0xbf800000;
            auVar175._28_4_ = 0xbf800000;
            auVar46._8_4_ = 0x40000000;
            auVar46._0_8_ = 0x4000000040000000;
            auVar46._12_4_ = 0x40000000;
            auVar46._16_4_ = 0x40000000;
            auVar46._20_4_ = 0x40000000;
            auVar46._24_4_ = 0x40000000;
            auVar46._28_4_ = 0x40000000;
            local_680 = vfmadd132ps_avx512vl(local_4e0,auVar175,auVar46);
            local_4e0 = local_680;
            auVar130 = local_4e0;
            local_640 = 0;
            local_630 = local_960;
            uStack_628 = uStack_958;
            local_620 = local_8e0._0_8_;
            uStack_618 = local_8e0._8_8_;
            local_610 = local_8f0._0_8_;
            uStack_608 = local_8f0._8_8_;
            local_600 = local_8d0;
            uStack_5f8 = uStack_8c8;
            local_4e0 = auVar130;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar205 = 1.0 / auVar124._0_4_;
              local_5e0[0] = fVar205 * (local_860._0_4_ + 0.0);
              local_5e0[1] = fVar205 * (local_860._4_4_ + 1.0);
              local_5e0[2] = fVar205 * (local_860._8_4_ + 2.0);
              local_5e0[3] = fVar205 * (local_860._12_4_ + 3.0);
              fStack_5d0 = fVar205 * (local_860._16_4_ + 4.0);
              fStack_5cc = fVar205 * (local_860._20_4_ + 5.0);
              fStack_5c8 = fVar205 * (local_860._24_4_ + 6.0);
              fStack_5c4 = local_860._28_4_ + 7.0;
              local_4e0._0_8_ = local_680._0_8_;
              local_4e0._8_8_ = local_680._8_8_;
              local_4e0._16_8_ = local_680._16_8_;
              local_4e0._24_8_ = local_680._24_8_;
              local_5c0 = local_4e0._0_8_;
              uStack_5b8 = local_4e0._8_8_;
              uStack_5b0 = local_4e0._16_8_;
              uStack_5a8 = local_4e0._24_8_;
              local_5a0 = local_880;
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar130 = vblendmps_avx512vl(auVar176,local_880);
              auVar141._0_4_ =
                   (uint)(bVar104 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar104 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar104 >> 6 & 1);
              auVar141._24_4_ = (uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar141._28_4_ =
                   (uint)(bVar104 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar104 >> 7) * 0x7f800000
              ;
              auVar130 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar130 = vminps_avx(auVar141,auVar130);
              auVar132 = vshufpd_avx(auVar130,auVar130,5);
              auVar130 = vminps_avx(auVar130,auVar132);
              auVar132 = vpermpd_avx2(auVar130,0x4e);
              auVar130 = vminps_avx(auVar130,auVar132);
              uVar166 = vcmpps_avx512vl(auVar141,auVar130,0);
              bVar95 = (byte)uVar166 & bVar104;
              bVar96 = bVar104;
              if (bVar95 != 0) {
                bVar96 = bVar95;
              }
              uVar99 = 0;
              for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                uVar99 = uVar99 + 1;
              }
              uVar97 = (ulong)uVar99;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar205 = local_5e0[uVar97];
                uVar165 = *(undefined4 *)((long)&local_5c0 + uVar97 * 4);
                fVar213 = 1.0 - fVar205;
                fVar212 = fVar213 * fVar213 * -3.0;
                auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                           ZEXT416((uint)(fVar205 * fVar213)),ZEXT416(0xc0000000));
                auVar245 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar213)),
                                           ZEXT416((uint)(fVar205 * fVar205)),ZEXT416(0x40000000));
                fVar213 = auVar110._0_4_ * 3.0;
                fVar214 = auVar245._0_4_ * 3.0;
                fVar196 = fVar205 * fVar205 * 3.0;
                auVar218._0_4_ = fVar196 * (float)local_8d0._0_4_;
                auVar218._4_4_ = fVar196 * (float)local_8d0._4_4_;
                auVar218._8_4_ = fVar196 * (float)uStack_8c8;
                auVar218._12_4_ = fVar196 * uStack_8c8._4_4_;
                auVar192._4_4_ = fVar214;
                auVar192._0_4_ = fVar214;
                auVar192._8_4_ = fVar214;
                auVar192._12_4_ = fVar214;
                auVar110 = vfmadd132ps_fma(auVar192,auVar218,local_8f0);
                auVar199._4_4_ = fVar213;
                auVar199._0_4_ = fVar213;
                auVar199._8_4_ = fVar213;
                auVar199._12_4_ = fVar213;
                auVar110 = vfmadd132ps_fma(auVar199,auVar110,local_8e0);
                auVar193._4_4_ = fVar212;
                auVar193._0_4_ = fVar212;
                auVar193._8_4_ = fVar212;
                auVar193._12_4_ = fVar212;
                auVar110 = vfmadd132ps_fma(auVar193,auVar110,auVar30);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar110._0_4_;
                uVar10 = vextractps_avx(auVar110,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                uVar10 = vextractps_avx(auVar110,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                *(float *)(ray + k * 4 + 0x3c0) = fVar205;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar165;
                *(uint *)(ray + k * 4 + 0x440) = uVar8;
                *(uint *)(ray + k * 4 + 0x480) = uVar7;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar154 = vpbroadcastd_avx512f();
                local_440 = vmovdqa64_avx512f(auVar154);
                auVar154 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar154);
                local_900 = local_8e0._0_4_;
                uStack_8fc = local_8e0._4_4_;
                uStack_8f8 = local_8e0._8_8_;
                local_820 = local_8f0._0_4_;
                uStack_81c = local_8f0._4_4_;
                uStack_818 = local_8f0._8_8_;
                local_910 = auVar111;
                local_830 = (float)local_8d0._0_4_;
                fStack_82c = (float)local_8d0._4_4_;
                fStack_828 = (float)uStack_8c8;
                fStack_824 = uStack_8c8._4_4_;
                local_7e0 = auVar120;
                local_6a0 = local_860;
                local_660 = local_880;
                local_63c = iVar9;
                local_5f0 = bVar104;
                do {
                  auVar245 = auVar246._0_16_;
                  local_520 = (float)*(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar97]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_5c0 + uVar97 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                  local_948.context = context->user;
                  fVar214 = local_200._0_4_;
                  fVar212 = 1.0 - fVar214;
                  fVar205 = fVar212 * fVar212 * -3.0;
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar212)),
                                             ZEXT416((uint)(fVar214 * fVar212)),ZEXT416(0xc0000000))
                  ;
                  auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar214 * fVar212)),
                                             ZEXT416((uint)(fVar214 * fVar214)),ZEXT416(0x40000000))
                  ;
                  fVar212 = auVar111._0_4_ * 3.0;
                  fVar213 = auVar110._0_4_ * 3.0;
                  fVar214 = fVar214 * fVar214 * 3.0;
                  auVar221._0_4_ = fVar214 * local_830;
                  auVar221._4_4_ = fVar214 * fStack_82c;
                  auVar221._8_4_ = fVar214 * fStack_828;
                  auVar221._12_4_ = fVar214 * fStack_824;
                  auVar173._4_4_ = fVar213;
                  auVar173._0_4_ = fVar213;
                  auVar173._8_4_ = fVar213;
                  auVar173._12_4_ = fVar213;
                  auVar93._4_4_ = uStack_81c;
                  auVar93._0_4_ = local_820;
                  auVar93._8_8_ = uStack_818;
                  auVar111 = vfmadd132ps_fma(auVar173,auVar221,auVar93);
                  auVar202._4_4_ = fVar212;
                  auVar202._0_4_ = fVar212;
                  auVar202._8_4_ = fVar212;
                  auVar202._12_4_ = fVar212;
                  auVar91._4_4_ = uStack_8fc;
                  auVar91._0_4_ = local_900;
                  auVar91._8_8_ = uStack_8f8;
                  auVar111 = vfmadd132ps_fma(auVar202,auVar111,auVar91);
                  auVar174._4_4_ = fVar205;
                  auVar174._0_4_ = fVar205;
                  auVar174._8_4_ = fVar205;
                  auVar174._12_4_ = fVar205;
                  auVar111 = vfmadd132ps_fma(auVar174,auVar111,auVar30);
                  auVar154 = vbroadcastss_avx512f(auVar111);
                  auVar155 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar155,ZEXT1664(auVar111));
                  auVar155 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar155,ZEXT1664(auVar111));
                  local_2c0[0] = (RTCHitN)auVar154[0];
                  local_2c0[1] = (RTCHitN)auVar154[1];
                  local_2c0[2] = (RTCHitN)auVar154[2];
                  local_2c0[3] = (RTCHitN)auVar154[3];
                  local_2c0[4] = (RTCHitN)auVar154[4];
                  local_2c0[5] = (RTCHitN)auVar154[5];
                  local_2c0[6] = (RTCHitN)auVar154[6];
                  local_2c0[7] = (RTCHitN)auVar154[7];
                  local_2c0[8] = (RTCHitN)auVar154[8];
                  local_2c0[9] = (RTCHitN)auVar154[9];
                  local_2c0[10] = (RTCHitN)auVar154[10];
                  local_2c0[0xb] = (RTCHitN)auVar154[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar154[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar154[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar154[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar154[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar154[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar154[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar154[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar154[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar154[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar154[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar154[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar154[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar154[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar154[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar154[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar154[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar154[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar154[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar154[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar154[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar154[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar154[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar154[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar154[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar154[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar154[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar154[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar154[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar154[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar154[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar154[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar154[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar154[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar154[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar154[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar154[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar154[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar154[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar154[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar154[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar154[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar154[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar154[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar154[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar154[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar154[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar154[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar154[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar154[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar154[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar154[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar154[0x3f];
                  local_180 = local_480._0_8_;
                  uStack_178 = local_480._8_8_;
                  uStack_170 = local_480._16_8_;
                  uStack_168 = local_480._24_8_;
                  uStack_160 = local_480._32_8_;
                  uStack_158 = local_480._40_8_;
                  uStack_150 = local_480._48_8_;
                  uStack_148 = local_480._56_8_;
                  auVar154 = vmovdqa64_avx512f(local_440);
                  local_140 = vmovdqa64_avx512f(auVar154);
                  auVar130 = vpcmpeqd_avx2(auVar154._0_32_,auVar154._0_32_);
                  local_918[3] = auVar130;
                  local_918[2] = auVar130;
                  local_918[1] = auVar130;
                  *local_918 = auVar130;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instPrimID[0]));
                  local_580 = local_300;
                  local_948.valid = (int *)local_580;
                  local_948.geometryUserPtr = pGVar11->userPtr;
                  local_948.hit = local_2c0;
                  local_948.N = 0x10;
                  local_6c0 = (uint)uVar97;
                  uStack_6bc = (uint)(uVar97 >> 0x20);
                  local_948.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->intersectionFilterN)(&local_948);
                    uVar97 = CONCAT44(uStack_6bc,local_6c0);
                    auVar252 = ZEXT1664(local_910);
                    auVar243 = ZEXT3264(local_7e0);
                    auVar251 = ZEXT3264(local_740);
                    auVar181 = ZEXT3264(local_720);
                    auVar250 = ZEXT3264(local_7c0);
                    auVar249 = ZEXT3264(local_7a0);
                    auVar248 = ZEXT3264(local_700);
                    auVar247 = ZEXT3264(local_780);
                    auVar242 = ZEXT3264(local_6e0);
                    auVar244 = ZEXT3264(local_760);
                    auVar111 = vxorps_avx512vl(auVar245,auVar245);
                    auVar246 = ZEXT1664(auVar111);
                    uVar101 = local_800._0_4_;
                  }
                  auVar111 = auVar246._0_16_;
                  auVar154 = vmovdqa64_avx512f(local_580);
                  uVar166 = vptestmd_avx512f(auVar154,auVar154);
                  if ((short)uVar166 == 0) {
LAB_01c8bc38:
                    *(float *)(ray + k * 4 + 0x200) = local_520;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_948);
                      uVar97 = CONCAT44(uStack_6bc,local_6c0);
                      auVar252 = ZEXT1664(local_910);
                      auVar243 = ZEXT3264(local_7e0);
                      auVar251 = ZEXT3264(local_740);
                      auVar181 = ZEXT3264(local_720);
                      auVar250 = ZEXT3264(local_7c0);
                      auVar249 = ZEXT3264(local_7a0);
                      auVar248 = ZEXT3264(local_700);
                      auVar247 = ZEXT3264(local_780);
                      auVar242 = ZEXT3264(local_6e0);
                      auVar244 = ZEXT3264(local_760);
                      auVar111 = vxorps_avx512vl(auVar111,auVar111);
                      auVar246 = ZEXT1664(auVar111);
                      uVar101 = local_800._0_4_;
                    }
                    auVar154 = vmovdqa64_avx512f(local_580);
                    uVar38 = vptestmd_avx512f(auVar154,auVar154);
                    if ((short)uVar38 == 0) goto LAB_01c8bc38;
                    iVar1 = *(int *)(local_948.hit + 4);
                    iVar2 = *(int *)(local_948.hit + 8);
                    iVar78 = *(int *)(local_948.hit + 0xc);
                    iVar79 = *(int *)(local_948.hit + 0x10);
                    iVar80 = *(int *)(local_948.hit + 0x14);
                    iVar81 = *(int *)(local_948.hit + 0x18);
                    iVar82 = *(int *)(local_948.hit + 0x1c);
                    iVar83 = *(int *)(local_948.hit + 0x20);
                    iVar84 = *(int *)(local_948.hit + 0x24);
                    iVar85 = *(int *)(local_948.hit + 0x28);
                    iVar86 = *(int *)(local_948.hit + 0x2c);
                    iVar87 = *(int *)(local_948.hit + 0x30);
                    iVar88 = *(int *)(local_948.hit + 0x34);
                    iVar89 = *(int *)(local_948.hit + 0x38);
                    iVar90 = *(int *)(local_948.hit + 0x3c);
                    bVar96 = (byte)uVar38;
                    bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                    bVar95 = (byte)(uVar38 >> 8);
                    bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                    bVar29 = SUB81(uVar38 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x300) =
                         (uint)(bVar96 & 1) * *(int *)local_948.hit |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_948.ray + 0x300);
                    *(uint *)(local_948.ray + 0x304) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x304);
                    *(uint *)(local_948.ray + 0x308) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x308);
                    *(uint *)(local_948.ray + 0x30c) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x30c);
                    *(uint *)(local_948.ray + 0x310) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x310);
                    *(uint *)(local_948.ray + 0x314) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x314);
                    *(uint *)(local_948.ray + 0x318) =
                         (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x318);
                    *(uint *)(local_948.ray + 0x31c) =
                         (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x31c);
                    *(uint *)(local_948.ray + 800) =
                         (uint)(bVar95 & 1) * iVar83 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 800);
                    *(uint *)(local_948.ray + 0x324) =
                         (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x324);
                    *(uint *)(local_948.ray + 0x328) =
                         (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x328);
                    *(uint *)(local_948.ray + 0x32c) =
                         (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x32c);
                    *(uint *)(local_948.ray + 0x330) =
                         (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x330);
                    *(uint *)(local_948.ray + 0x334) =
                         (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x334);
                    *(uint *)(local_948.ray + 0x338) =
                         (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x338);
                    *(uint *)(local_948.ray + 0x33c) =
                         (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x33c);
                    iVar1 = *(int *)(local_948.hit + 0x44);
                    iVar2 = *(int *)(local_948.hit + 0x48);
                    iVar78 = *(int *)(local_948.hit + 0x4c);
                    iVar79 = *(int *)(local_948.hit + 0x50);
                    iVar80 = *(int *)(local_948.hit + 0x54);
                    iVar81 = *(int *)(local_948.hit + 0x58);
                    iVar82 = *(int *)(local_948.hit + 0x5c);
                    iVar83 = *(int *)(local_948.hit + 0x60);
                    iVar84 = *(int *)(local_948.hit + 100);
                    iVar85 = *(int *)(local_948.hit + 0x68);
                    iVar86 = *(int *)(local_948.hit + 0x6c);
                    iVar87 = *(int *)(local_948.hit + 0x70);
                    iVar88 = *(int *)(local_948.hit + 0x74);
                    iVar89 = *(int *)(local_948.hit + 0x78);
                    iVar90 = *(int *)(local_948.hit + 0x7c);
                    bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                    bVar29 = SUB81(uVar38 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x340) =
                         (uint)(bVar96 & 1) * *(int *)(local_948.hit + 0x40) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_948.ray + 0x340);
                    *(uint *)(local_948.ray + 0x344) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x344);
                    *(uint *)(local_948.ray + 0x348) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x348);
                    *(uint *)(local_948.ray + 0x34c) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x34c);
                    *(uint *)(local_948.ray + 0x350) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x350);
                    *(uint *)(local_948.ray + 0x354) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x354);
                    *(uint *)(local_948.ray + 0x358) =
                         (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x358);
                    *(uint *)(local_948.ray + 0x35c) =
                         (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x35c);
                    *(uint *)(local_948.ray + 0x360) =
                         (uint)(bVar95 & 1) * iVar83 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x360);
                    *(uint *)(local_948.ray + 0x364) =
                         (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x364);
                    *(uint *)(local_948.ray + 0x368) =
                         (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x368);
                    *(uint *)(local_948.ray + 0x36c) =
                         (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x36c);
                    *(uint *)(local_948.ray + 0x370) =
                         (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x370);
                    *(uint *)(local_948.ray + 0x374) =
                         (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x374);
                    *(uint *)(local_948.ray + 0x378) =
                         (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x378);
                    *(uint *)(local_948.ray + 0x37c) =
                         (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x37c);
                    iVar1 = *(int *)(local_948.hit + 0x84);
                    iVar2 = *(int *)(local_948.hit + 0x88);
                    iVar78 = *(int *)(local_948.hit + 0x8c);
                    iVar79 = *(int *)(local_948.hit + 0x90);
                    iVar80 = *(int *)(local_948.hit + 0x94);
                    iVar81 = *(int *)(local_948.hit + 0x98);
                    iVar82 = *(int *)(local_948.hit + 0x9c);
                    iVar83 = *(int *)(local_948.hit + 0xa0);
                    iVar84 = *(int *)(local_948.hit + 0xa4);
                    iVar85 = *(int *)(local_948.hit + 0xa8);
                    iVar86 = *(int *)(local_948.hit + 0xac);
                    iVar87 = *(int *)(local_948.hit + 0xb0);
                    iVar88 = *(int *)(local_948.hit + 0xb4);
                    iVar89 = *(int *)(local_948.hit + 0xb8);
                    iVar90 = *(int *)(local_948.hit + 0xbc);
                    bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                    bVar29 = SUB81(uVar38 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x380) =
                         (uint)(bVar96 & 1) * *(int *)(local_948.hit + 0x80) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_948.ray + 0x380);
                    *(uint *)(local_948.ray + 900) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 900);
                    *(uint *)(local_948.ray + 0x388) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x388);
                    *(uint *)(local_948.ray + 0x38c) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x38c);
                    *(uint *)(local_948.ray + 0x390) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x390);
                    *(uint *)(local_948.ray + 0x394) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x394);
                    *(uint *)(local_948.ray + 0x398) =
                         (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x398);
                    *(uint *)(local_948.ray + 0x39c) =
                         (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x39c);
                    *(uint *)(local_948.ray + 0x3a0) =
                         (uint)(bVar95 & 1) * iVar83 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x3a0);
                    *(uint *)(local_948.ray + 0x3a4) =
                         (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3a4);
                    *(uint *)(local_948.ray + 0x3a8) =
                         (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x3a8);
                    *(uint *)(local_948.ray + 0x3ac) =
                         (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3ac);
                    *(uint *)(local_948.ray + 0x3b0) =
                         (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3b0);
                    *(uint *)(local_948.ray + 0x3b4) =
                         (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3b4);
                    *(uint *)(local_948.ray + 0x3b8) =
                         (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3b8);
                    *(uint *)(local_948.ray + 0x3bc) =
                         (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3bc);
                    iVar1 = *(int *)(local_948.hit + 0xc4);
                    iVar2 = *(int *)(local_948.hit + 200);
                    iVar78 = *(int *)(local_948.hit + 0xcc);
                    iVar79 = *(int *)(local_948.hit + 0xd0);
                    iVar80 = *(int *)(local_948.hit + 0xd4);
                    iVar81 = *(int *)(local_948.hit + 0xd8);
                    iVar82 = *(int *)(local_948.hit + 0xdc);
                    iVar83 = *(int *)(local_948.hit + 0xe0);
                    iVar84 = *(int *)(local_948.hit + 0xe4);
                    iVar85 = *(int *)(local_948.hit + 0xe8);
                    iVar86 = *(int *)(local_948.hit + 0xec);
                    iVar87 = *(int *)(local_948.hit + 0xf0);
                    iVar88 = *(int *)(local_948.hit + 0xf4);
                    iVar89 = *(int *)(local_948.hit + 0xf8);
                    iVar90 = *(int *)(local_948.hit + 0xfc);
                    bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                    bVar29 = SUB81(uVar38 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x3c0) =
                         (uint)(bVar96 & 1) * *(int *)(local_948.hit + 0xc0) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_948.ray + 0x3c0);
                    *(uint *)(local_948.ray + 0x3c4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x3c4);
                    *(uint *)(local_948.ray + 0x3c8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x3c8);
                    *(uint *)(local_948.ray + 0x3cc) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x3cc);
                    *(uint *)(local_948.ray + 0x3d0) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x3d0);
                    *(uint *)(local_948.ray + 0x3d4) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x3d4);
                    *(uint *)(local_948.ray + 0x3d8) =
                         (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x3d8);
                    *(uint *)(local_948.ray + 0x3dc) =
                         (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x3dc);
                    *(uint *)(local_948.ray + 0x3e0) =
                         (uint)(bVar95 & 1) * iVar83 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x3e0);
                    *(uint *)(local_948.ray + 0x3e4) =
                         (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3e4);
                    *(uint *)(local_948.ray + 1000) =
                         (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 1000);
                    *(uint *)(local_948.ray + 0x3ec) =
                         (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3ec);
                    *(uint *)(local_948.ray + 0x3f0) =
                         (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3f0);
                    *(uint *)(local_948.ray + 0x3f4) =
                         (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3f4);
                    *(uint *)(local_948.ray + 0x3f8) =
                         (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3f8);
                    *(uint *)(local_948.ray + 0x3fc) =
                         (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3fc);
                    iVar1 = *(int *)(local_948.hit + 0x104);
                    iVar2 = *(int *)(local_948.hit + 0x108);
                    iVar78 = *(int *)(local_948.hit + 0x10c);
                    iVar79 = *(int *)(local_948.hit + 0x110);
                    iVar80 = *(int *)(local_948.hit + 0x114);
                    iVar81 = *(int *)(local_948.hit + 0x118);
                    iVar82 = *(int *)(local_948.hit + 0x11c);
                    iVar83 = *(int *)(local_948.hit + 0x120);
                    iVar84 = *(int *)(local_948.hit + 0x124);
                    iVar85 = *(int *)(local_948.hit + 0x128);
                    iVar86 = *(int *)(local_948.hit + 300);
                    iVar87 = *(int *)(local_948.hit + 0x130);
                    iVar88 = *(int *)(local_948.hit + 0x134);
                    iVar89 = *(int *)(local_948.hit + 0x138);
                    iVar90 = *(int *)(local_948.hit + 0x13c);
                    bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                    bVar29 = SUB81(uVar38 >> 0xf,0);
                    *(uint *)(local_948.ray + 0x400) =
                         (uint)(bVar96 & 1) * *(int *)(local_948.hit + 0x100) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_948.ray + 0x400);
                    *(uint *)(local_948.ray + 0x404) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x404);
                    *(uint *)(local_948.ray + 0x408) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x408);
                    *(uint *)(local_948.ray + 0x40c) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x40c);
                    *(uint *)(local_948.ray + 0x410) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x410);
                    *(uint *)(local_948.ray + 0x414) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x414);
                    *(uint *)(local_948.ray + 0x418) =
                         (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x418);
                    *(uint *)(local_948.ray + 0x41c) =
                         (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x41c);
                    *(uint *)(local_948.ray + 0x420) =
                         (uint)(bVar95 & 1) * iVar83 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x420);
                    *(uint *)(local_948.ray + 0x424) =
                         (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x424);
                    *(uint *)(local_948.ray + 0x428) =
                         (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x428);
                    *(uint *)(local_948.ray + 0x42c) =
                         (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x42c);
                    *(uint *)(local_948.ray + 0x430) =
                         (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x430);
                    *(uint *)(local_948.ray + 0x434) =
                         (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x434);
                    *(uint *)(local_948.ray + 0x438) =
                         (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x438);
                    *(uint *)(local_948.ray + 0x43c) =
                         (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x43c);
                    auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x140));
                    auVar154 = vmovdqu32_avx512f(auVar154);
                    *(undefined1 (*) [64])(local_948.ray + 0x440) = auVar154;
                    auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x180));
                    auVar154 = vmovdqu32_avx512f(auVar154);
                    *(undefined1 (*) [64])(local_948.ray + 0x480) = auVar154;
                    auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x1c0));
                    auVar154 = vmovdqa32_avx512f(auVar154);
                    *(undefined1 (*) [64])(local_948.ray + 0x4c0) = auVar154;
                    auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x200));
                    auVar154 = vmovdqa32_avx512f(auVar154);
                    *(undefined1 (*) [64])(local_948.ray + 0x500) = auVar154;
                  }
                  auVar111 = auVar252._0_16_;
                  auVar120 = auVar243._0_32_;
                  bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar104;
                  uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar52._4_4_ = uVar165;
                  auVar52._0_4_ = uVar165;
                  auVar52._8_4_ = uVar165;
                  auVar52._12_4_ = uVar165;
                  auVar52._16_4_ = uVar165;
                  auVar52._20_4_ = uVar165;
                  auVar52._24_4_ = uVar165;
                  auVar52._28_4_ = uVar165;
                  uVar166 = vcmpps_avx512vl(local_880,auVar52,2);
                  bVar104 = bVar96 & (byte)uVar166;
                  if ((bVar96 & (byte)uVar166) != 0) {
                    auVar180._8_4_ = 0x7f800000;
                    auVar180._0_8_ = 0x7f8000007f800000;
                    auVar180._12_4_ = 0x7f800000;
                    auVar180._16_4_ = 0x7f800000;
                    auVar180._20_4_ = 0x7f800000;
                    auVar180._24_4_ = 0x7f800000;
                    auVar180._28_4_ = 0x7f800000;
                    auVar130 = vblendmps_avx512vl(auVar180,local_880);
                    auVar153._0_4_ =
                         (uint)(bVar104 & 1) * auVar130._0_4_ |
                         (uint)!(bool)(bVar104 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 1 & 1);
                    auVar153._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 2 & 1);
                    auVar153._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 3 & 1);
                    auVar153._12_4_ = (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 4 & 1);
                    auVar153._16_4_ = (uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 5 & 1);
                    auVar153._20_4_ = (uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar104 >> 6 & 1);
                    auVar153._24_4_ = (uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar153._28_4_ =
                         (uint)(bVar104 >> 7) * auVar130._28_4_ |
                         (uint)!(bool)(bVar104 >> 7) * 0x7f800000;
                    auVar130 = vshufps_avx(auVar153,auVar153,0xb1);
                    auVar130 = vminps_avx(auVar153,auVar130);
                    auVar132 = vshufpd_avx(auVar130,auVar130,5);
                    auVar130 = vminps_avx(auVar130,auVar132);
                    auVar132 = vpermpd_avx2(auVar130,0x4e);
                    auVar130 = vminps_avx(auVar130,auVar132);
                    uVar166 = vcmpps_avx512vl(auVar153,auVar130,0);
                    bVar95 = (byte)uVar166 & bVar104;
                    bVar96 = bVar104;
                    if (bVar95 != 0) {
                      bVar96 = bVar95;
                    }
                    uVar99 = 0;
                    for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000
                        ) {
                      uVar99 = uVar99 + 1;
                    }
                    uVar97 = (ulong)uVar99;
                  }
                } while (bVar104 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        auVar130 = vpbroadcastd_avx512vl();
        auVar243 = ZEXT3264(auVar130);
        local_800 = vbroadcastss_avx512vl(auVar111);
        local_520 = 1.0 / auVar124._0_4_;
        fStack_51c = local_520;
        fStack_518 = local_520;
        fStack_514 = local_520;
        fStack_510 = local_520;
        fStack_50c = local_520;
        fStack_508 = local_520;
        fStack_504 = local_520;
        auVar252 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar252);
        auVar252 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar252);
        lVar100 = 8;
        local_7e0 = auVar120;
        local_6c0 = uVar101;
        uStack_6bc = uVar101;
        uStack_6b8 = uVar101;
        uStack_6b4 = uVar101;
        uStack_6b0 = uVar101;
        uStack_6ac = uVar101;
        uStack_6a8 = uVar101;
        uStack_6a4 = uVar101;
        do {
          auVar130 = vpbroadcastd_avx512vl();
          auVar115 = vpor_avx2(auVar130,_DAT_0205a920);
          uVar37 = vpcmpgtd_avx512vl(auVar243._0_32_,auVar115);
          auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar100 * 4 + lVar39);
          auVar132 = *(undefined1 (*) [32])(lVar39 + 0x2227768 + lVar100 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar39 + 0x2227bec + lVar100 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar39 + 0x2228070 + lVar100 * 4);
          local_720 = auVar181._0_32_;
          auVar116 = vmulps_avx512vl(local_720,auVar127);
          local_740 = auVar251._0_32_;
          auVar126 = vmulps_avx512vl(local_740,auVar127);
          auVar59._4_4_ = auVar127._4_4_ * (float)local_380._4_4_;
          auVar59._0_4_ = auVar127._0_4_ * (float)local_380._0_4_;
          auVar59._8_4_ = auVar127._8_4_ * fStack_378;
          auVar59._12_4_ = auVar127._12_4_ * fStack_374;
          auVar59._16_4_ = auVar127._16_4_ * fStack_370;
          auVar59._20_4_ = auVar127._20_4_ * fStack_36c;
          auVar59._24_4_ = auVar127._24_4_ * fStack_368;
          auVar59._28_4_ = auVar115._28_4_;
          auVar134 = auVar249._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar116,auVar128,auVar134);
          auVar135 = auVar250._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar126,auVar128,auVar135);
          auVar126 = vfmadd231ps_avx512vl(auVar59,auVar128,local_360);
          auVar133 = auVar247._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar132,auVar133);
          local_700 = auVar248._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar132,local_700);
          auVar111 = vfmadd231ps_fma(auVar126,auVar132,local_340);
          auVar131 = auVar244._0_32_;
          auVar119 = vfmadd231ps_avx512vl(auVar115,auVar130,auVar131);
          local_6e0 = auVar242._0_32_;
          auVar121 = vfmadd231ps_avx512vl(auVar116,auVar130,local_6e0);
          auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar100 * 4 + lVar39);
          auVar116 = *(undefined1 (*) [32])(lVar39 + 0x2229b88 + lVar100 * 4);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar130,local_320);
          auVar126 = *(undefined1 (*) [32])(lVar39 + 0x222a00c + lVar100 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar39 + 0x222a490 + lVar100 * 4);
          auVar120 = vmulps_avx512vl(local_720,auVar117);
          auVar118 = vmulps_avx512vl(local_740,auVar117);
          auVar60._4_4_ = auVar117._4_4_ * (float)local_380._4_4_;
          auVar60._0_4_ = auVar117._0_4_ * (float)local_380._0_4_;
          auVar60._8_4_ = auVar117._8_4_ * fStack_378;
          auVar60._12_4_ = auVar117._12_4_ * fStack_374;
          auVar60._16_4_ = auVar117._16_4_ * fStack_370;
          auVar60._20_4_ = auVar117._20_4_ * fStack_36c;
          auVar60._24_4_ = auVar117._24_4_ * fStack_368;
          auVar60._28_4_ = uStack_364;
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,auVar134);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar126,auVar135);
          auVar122 = vfmadd231ps_avx512vl(auVar60,auVar126,local_360);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar133);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_700);
          auVar110 = vfmadd231ps_fma(auVar122,auVar116,local_340);
          auVar122 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar131);
          auVar123 = vfmadd231ps_avx512vl(auVar118,auVar115,local_6e0);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar115,local_320);
          auVar124 = vmaxps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar110));
          auVar120 = vsubps_avx(auVar122,auVar119);
          auVar118 = vsubps_avx(auVar123,auVar121);
          auVar125 = vmulps_avx512vl(auVar121,auVar120);
          auVar129 = vmulps_avx512vl(auVar119,auVar118);
          auVar125 = vsubps_avx512vl(auVar125,auVar129);
          auVar129 = vmulps_avx512vl(auVar118,auVar118);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar120,auVar120);
          auVar124 = vmulps_avx512vl(auVar124,auVar124);
          auVar124 = vmulps_avx512vl(auVar124,auVar129);
          auVar125 = vmulps_avx512vl(auVar125,auVar125);
          uVar166 = vcmpps_avx512vl(auVar125,auVar124,2);
          local_5f0 = (byte)uVar37 & (byte)uVar166;
          if (local_5f0 == 0) {
            auVar242 = ZEXT3264(local_6e0);
          }
          else {
            auVar117 = vmulps_avx512vl(local_7e0,auVar117);
            auVar126 = vfmadd213ps_avx512vl(auVar126,local_3e0,auVar117);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_3c0,auVar126);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_3a0,auVar116);
            auVar127 = vmulps_avx512vl(local_7e0,auVar127);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_3e0,auVar127);
            auVar132 = vfmadd213ps_avx512vl(auVar132,local_3c0,auVar128);
            auVar116 = vfmadd213ps_avx512vl(auVar130,local_3a0,auVar132);
            auVar130 = *(undefined1 (*) [32])(lVar39 + 0x22284f4 + lVar100 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar39 + 0x2228978 + lVar100 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar39 + 0x2228dfc + lVar100 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar39 + 0x2229280 + lVar100 * 4);
            auVar126 = vmulps_avx512vl(local_720,auVar127);
            auVar117 = vmulps_avx512vl(local_740,auVar127);
            auVar127 = vmulps_avx512vl(local_7e0,auVar127);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar128,auVar134);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar128,auVar135);
            auVar128 = vfmadd231ps_avx512vl(auVar127,local_3e0,auVar128);
            auVar127 = vfmadd231ps_avx512vl(auVar126,auVar132,auVar133);
            auVar126 = vfmadd231ps_avx512vl(auVar117,auVar132,local_700);
            auVar132 = vfmadd231ps_avx512vl(auVar128,local_3c0,auVar132);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar130,auVar131);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar130,local_6e0);
            auVar117 = vfmadd231ps_avx512vl(auVar132,local_3a0,auVar130);
            auVar130 = *(undefined1 (*) [32])(lVar39 + 0x222a914 + lVar100 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar39 + 0x222b21c + lVar100 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar39 + 0x222b6a0 + lVar100 * 4);
            auVar124 = vmulps_avx512vl(local_720,auVar128);
            auVar125 = vmulps_avx512vl(local_740,auVar128);
            auVar128 = vmulps_avx512vl(local_7e0,auVar128);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar132,auVar134);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar132,auVar135);
            auVar128 = vfmadd231ps_avx512vl(auVar128,local_3e0,auVar132);
            auVar132 = *(undefined1 (*) [32])(lVar39 + 0x222ad98 + lVar100 * 4);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar132,auVar133);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar132,local_700);
            auVar132 = vfmadd231ps_avx512vl(auVar128,local_3c0,auVar132);
            auVar128 = vfmadd231ps_avx512vl(auVar124,auVar130,auVar131);
            auVar124 = vfmadd231ps_avx512vl(auVar125,auVar130,local_6e0);
            auVar132 = vfmadd231ps_avx512vl(auVar132,local_3a0,auVar130);
            auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar127,auVar125);
            vandps_avx512vl(auVar126,auVar125);
            auVar130 = vmaxps_avx(auVar125,auVar125);
            vandps_avx512vl(auVar117,auVar125);
            auVar130 = vmaxps_avx(auVar130,auVar125);
            uVar97 = vcmpps_avx512vl(auVar130,local_800,1);
            bVar16 = (bool)((byte)uVar97 & 1);
            auVar142._0_4_ = (float)((uint)bVar16 * auVar120._0_4_ | (uint)!bVar16 * auVar127._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar127._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar127._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar127._12_4_);
            bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar127._16_4_);
            bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar127._20_4_);
            bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar127._24_4_);
            bVar16 = SUB81(uVar97 >> 7,0);
            auVar142._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar127._28_4_;
            bVar16 = (bool)((byte)uVar97 & 1);
            auVar143._0_4_ = (float)((uint)bVar16 * auVar118._0_4_ | (uint)!bVar16 * auVar126._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar126._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar126._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar126._12_4_);
            bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar143._16_4_ =
                 (float)((uint)bVar16 * auVar118._16_4_ | (uint)!bVar16 * auVar126._16_4_);
            bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar143._20_4_ =
                 (float)((uint)bVar16 * auVar118._20_4_ | (uint)!bVar16 * auVar126._20_4_);
            bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar143._24_4_ =
                 (float)((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar126._24_4_);
            bVar16 = SUB81(uVar97 >> 7,0);
            auVar143._28_4_ = (uint)bVar16 * auVar118._28_4_ | (uint)!bVar16 * auVar126._28_4_;
            vandps_avx512vl(auVar128,auVar125);
            vandps_avx512vl(auVar124,auVar125);
            auVar130 = vmaxps_avx(auVar143,auVar143);
            vandps_avx512vl(auVar132,auVar125);
            auVar130 = vmaxps_avx(auVar130,auVar143);
            uVar97 = vcmpps_avx512vl(auVar130,local_800,1);
            bVar16 = (bool)((byte)uVar97 & 1);
            auVar144._0_4_ = (uint)bVar16 * auVar120._0_4_ | (uint)!bVar16 * auVar128._0_4_;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar128._4_4_;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar128._8_4_;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar128._12_4_;
            bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar144._16_4_ = (uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar128._16_4_;
            bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar144._20_4_ = (uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar128._20_4_;
            bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar144._24_4_ = (uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar128._24_4_;
            bVar16 = SUB81(uVar97 >> 7,0);
            auVar144._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar128._28_4_;
            bVar16 = (bool)((byte)uVar97 & 1);
            auVar145._0_4_ = (float)((uint)bVar16 * auVar118._0_4_ | (uint)!bVar16 * auVar124._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar124._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar124._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar124._12_4_);
            bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar145._16_4_ =
                 (float)((uint)bVar16 * auVar118._16_4_ | (uint)!bVar16 * auVar124._16_4_);
            bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar145._20_4_ =
                 (float)((uint)bVar16 * auVar118._20_4_ | (uint)!bVar16 * auVar124._20_4_);
            bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar145._24_4_ =
                 (float)((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar124._24_4_);
            bVar16 = SUB81(uVar97 >> 7,0);
            auVar145._28_4_ = (uint)bVar16 * auVar118._28_4_ | (uint)!bVar16 * auVar124._28_4_;
            auVar232._8_4_ = 0x80000000;
            auVar232._0_8_ = 0x8000000080000000;
            auVar232._12_4_ = 0x80000000;
            auVar232._16_4_ = 0x80000000;
            auVar232._20_4_ = 0x80000000;
            auVar232._24_4_ = 0x80000000;
            auVar232._28_4_ = 0x80000000;
            auVar130 = vxorps_avx512vl(auVar144,auVar232);
            auVar124 = auVar246._0_32_;
            auVar132 = vfmadd213ps_avx512vl(auVar142,auVar142,auVar124);
            auVar245 = vfmadd231ps_fma(auVar132,auVar143,auVar143);
            auVar132 = vrsqrt14ps_avx512vl(ZEXT1632(auVar245));
            auVar241._8_4_ = 0xbf000000;
            auVar241._0_8_ = 0xbf000000bf000000;
            auVar241._12_4_ = 0xbf000000;
            auVar241._16_4_ = 0xbf000000;
            auVar241._20_4_ = 0xbf000000;
            auVar241._24_4_ = 0xbf000000;
            auVar241._28_4_ = 0xbf000000;
            fVar205 = auVar132._0_4_;
            fVar212 = auVar132._4_4_;
            fVar213 = auVar132._8_4_;
            fVar214 = auVar132._12_4_;
            fVar196 = auVar132._16_4_;
            fVar204 = auVar132._20_4_;
            fVar105 = auVar132._24_4_;
            auVar61._4_4_ = fVar212 * fVar212 * fVar212 * auVar245._4_4_ * -0.5;
            auVar61._0_4_ = fVar205 * fVar205 * fVar205 * auVar245._0_4_ * -0.5;
            auVar61._8_4_ = fVar213 * fVar213 * fVar213 * auVar245._8_4_ * -0.5;
            auVar61._12_4_ = fVar214 * fVar214 * fVar214 * auVar245._12_4_ * -0.5;
            auVar61._16_4_ = fVar196 * fVar196 * fVar196 * -0.0;
            auVar61._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
            auVar61._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
            auVar61._28_4_ = auVar143._28_4_;
            auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar132 = vfmadd231ps_avx512vl(auVar61,auVar128,auVar132);
            auVar62._4_4_ = auVar143._4_4_ * auVar132._4_4_;
            auVar62._0_4_ = auVar143._0_4_ * auVar132._0_4_;
            auVar62._8_4_ = auVar143._8_4_ * auVar132._8_4_;
            auVar62._12_4_ = auVar143._12_4_ * auVar132._12_4_;
            auVar62._16_4_ = auVar143._16_4_ * auVar132._16_4_;
            auVar62._20_4_ = auVar143._20_4_ * auVar132._20_4_;
            auVar62._24_4_ = auVar143._24_4_ * auVar132._24_4_;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = auVar132._4_4_ * -auVar142._4_4_;
            auVar63._0_4_ = auVar132._0_4_ * -auVar142._0_4_;
            auVar63._8_4_ = auVar132._8_4_ * -auVar142._8_4_;
            auVar63._12_4_ = auVar132._12_4_ * -auVar142._12_4_;
            auVar63._16_4_ = auVar132._16_4_ * -auVar142._16_4_;
            auVar63._20_4_ = auVar132._20_4_ * -auVar142._20_4_;
            auVar63._24_4_ = auVar132._24_4_ * -auVar142._24_4_;
            auVar63._28_4_ = auVar143._28_4_;
            auVar127 = vmulps_avx512vl(auVar132,auVar124);
            auVar132 = vfmadd213ps_avx512vl(auVar144,auVar144,auVar124);
            auVar132 = vfmadd231ps_avx512vl(auVar132,auVar145,auVar145);
            auVar126 = vrsqrt14ps_avx512vl(auVar132);
            auVar132 = vmulps_avx512vl(auVar132,auVar241);
            fVar205 = auVar126._0_4_;
            fVar212 = auVar126._4_4_;
            fVar213 = auVar126._8_4_;
            fVar214 = auVar126._12_4_;
            fVar196 = auVar126._16_4_;
            fVar204 = auVar126._20_4_;
            fVar105 = auVar126._24_4_;
            auVar64._4_4_ = fVar212 * fVar212 * fVar212 * auVar132._4_4_;
            auVar64._0_4_ = fVar205 * fVar205 * fVar205 * auVar132._0_4_;
            auVar64._8_4_ = fVar213 * fVar213 * fVar213 * auVar132._8_4_;
            auVar64._12_4_ = fVar214 * fVar214 * fVar214 * auVar132._12_4_;
            auVar64._16_4_ = fVar196 * fVar196 * fVar196 * auVar132._16_4_;
            auVar64._20_4_ = fVar204 * fVar204 * fVar204 * auVar132._20_4_;
            auVar64._24_4_ = fVar105 * fVar105 * fVar105 * auVar132._24_4_;
            auVar64._28_4_ = auVar132._28_4_;
            auVar132 = vfmadd231ps_avx512vl(auVar64,auVar128,auVar126);
            auVar65._4_4_ = auVar145._4_4_ * auVar132._4_4_;
            auVar65._0_4_ = auVar145._0_4_ * auVar132._0_4_;
            auVar65._8_4_ = auVar145._8_4_ * auVar132._8_4_;
            auVar65._12_4_ = auVar145._12_4_ * auVar132._12_4_;
            auVar65._16_4_ = auVar145._16_4_ * auVar132._16_4_;
            auVar65._20_4_ = auVar145._20_4_ * auVar132._20_4_;
            auVar65._24_4_ = auVar145._24_4_ * auVar132._24_4_;
            auVar65._28_4_ = auVar126._28_4_;
            auVar66._4_4_ = auVar132._4_4_ * auVar130._4_4_;
            auVar66._0_4_ = auVar132._0_4_ * auVar130._0_4_;
            auVar66._8_4_ = auVar132._8_4_ * auVar130._8_4_;
            auVar66._12_4_ = auVar132._12_4_ * auVar130._12_4_;
            auVar66._16_4_ = auVar132._16_4_ * auVar130._16_4_;
            auVar66._20_4_ = auVar132._20_4_ * auVar130._20_4_;
            auVar66._24_4_ = auVar132._24_4_ * auVar130._24_4_;
            auVar66._28_4_ = auVar130._28_4_;
            auVar130 = vmulps_avx512vl(auVar132,auVar124);
            auVar245 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar111),auVar119);
            auVar132 = ZEXT1632(auVar111);
            auVar31 = vfmadd213ps_fma(auVar63,auVar132,auVar121);
            auVar128 = vfmadd213ps_avx512vl(auVar127,auVar132,auVar116);
            auVar126 = vfmadd213ps_avx512vl(auVar65,ZEXT1632(auVar110),auVar122);
            auVar36 = vfnmadd213ps_fma(auVar62,auVar132,auVar119);
            auVar117 = ZEXT1632(auVar110);
            auVar32 = vfmadd213ps_fma(auVar66,auVar117,auVar123);
            auVar112 = vfnmadd213ps_fma(auVar63,auVar132,auVar121);
            auVar33 = vfmadd213ps_fma(auVar130,auVar117,auVar115);
            auVar121 = ZEXT1632(auVar111);
            auVar41 = vfnmadd231ps_fma(auVar116,auVar121,auVar127);
            auVar113 = vfnmadd213ps_fma(auVar65,auVar117,auVar122);
            auVar40 = vfnmadd213ps_fma(auVar66,auVar117,auVar123);
            auVar114 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar110),auVar130);
            auVar115 = vsubps_avx512vl(auVar126,ZEXT1632(auVar36));
            auVar130 = vsubps_avx(ZEXT1632(auVar32),ZEXT1632(auVar112));
            auVar132 = vsubps_avx(ZEXT1632(auVar33),ZEXT1632(auVar41));
            auVar67._4_4_ = auVar130._4_4_ * auVar41._4_4_;
            auVar67._0_4_ = auVar130._0_4_ * auVar41._0_4_;
            auVar67._8_4_ = auVar130._8_4_ * auVar41._8_4_;
            auVar67._12_4_ = auVar130._12_4_ * auVar41._12_4_;
            auVar67._16_4_ = auVar130._16_4_ * 0.0;
            auVar67._20_4_ = auVar130._20_4_ * 0.0;
            auVar67._24_4_ = auVar130._24_4_ * 0.0;
            auVar67._28_4_ = auVar127._28_4_;
            auVar111 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar112),auVar132);
            auVar68._4_4_ = auVar132._4_4_ * auVar36._4_4_;
            auVar68._0_4_ = auVar132._0_4_ * auVar36._0_4_;
            auVar68._8_4_ = auVar132._8_4_ * auVar36._8_4_;
            auVar68._12_4_ = auVar132._12_4_ * auVar36._12_4_;
            auVar68._16_4_ = auVar132._16_4_ * 0.0;
            auVar68._20_4_ = auVar132._20_4_ * 0.0;
            auVar68._24_4_ = auVar132._24_4_ * 0.0;
            auVar68._28_4_ = auVar132._28_4_;
            auVar34 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar41),auVar115);
            auVar69._4_4_ = auVar112._4_4_ * auVar115._4_4_;
            auVar69._0_4_ = auVar112._0_4_ * auVar115._0_4_;
            auVar69._8_4_ = auVar112._8_4_ * auVar115._8_4_;
            auVar69._12_4_ = auVar112._12_4_ * auVar115._12_4_;
            auVar69._16_4_ = auVar115._16_4_ * 0.0;
            auVar69._20_4_ = auVar115._20_4_ * 0.0;
            auVar69._24_4_ = auVar115._24_4_ * 0.0;
            auVar69._28_4_ = auVar115._28_4_;
            auVar35 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar36),auVar130);
            auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar35),auVar124,ZEXT1632(auVar34));
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar124,ZEXT1632(auVar111));
            uVar97 = vcmpps_avx512vl(auVar130,auVar124,2);
            bVar104 = (byte)uVar97;
            fVar157 = (float)((uint)(bVar104 & 1) * auVar245._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * auVar113._0_4_);
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar159 = (float)((uint)bVar16 * auVar245._4_4_ | (uint)!bVar16 * auVar113._4_4_);
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar162 = (float)((uint)bVar16 * auVar245._8_4_ | (uint)!bVar16 * auVar113._8_4_);
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar163 = (float)((uint)bVar16 * auVar245._12_4_ | (uint)!bVar16 * auVar113._12_4_);
            auVar117 = ZEXT1632(CONCAT412(fVar163,CONCAT48(fVar162,CONCAT44(fVar159,fVar157))));
            fVar158 = (float)((uint)(bVar104 & 1) * auVar31._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * auVar40._0_4_);
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar161 = (float)((uint)bVar16 * auVar31._4_4_ | (uint)!bVar16 * auVar40._4_4_);
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar160 = (float)((uint)bVar16 * auVar31._8_4_ | (uint)!bVar16 * auVar40._8_4_);
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar164 = (float)((uint)bVar16 * auVar31._12_4_ | (uint)!bVar16 * auVar40._12_4_);
            auVar120 = ZEXT1632(CONCAT412(fVar164,CONCAT48(fVar160,CONCAT44(fVar161,fVar158))));
            auVar146._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar128._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar114._0_4_);
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar16 * auVar128._4_4_ | (uint)!bVar16 * auVar114._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar16 * auVar128._8_4_ | (uint)!bVar16 * auVar114._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar16 * auVar128._12_4_ | (uint)!bVar16 * auVar114._12_4_);
            fVar205 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar128._16_4_);
            auVar146._16_4_ = fVar205;
            fVar213 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar128._20_4_);
            auVar146._20_4_ = fVar213;
            fVar212 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar128._24_4_);
            auVar146._24_4_ = fVar212;
            iVar1 = (uint)(byte)(uVar97 >> 7) * auVar128._28_4_;
            auVar146._28_4_ = iVar1;
            auVar130 = vblendmps_avx512vl(ZEXT1632(auVar36),auVar126);
            auVar147._0_4_ =
                 (uint)(bVar104 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar104 & 1) * auVar111._0_4_;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar111._4_4_;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar111._8_4_;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar111._12_4_;
            auVar147._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar130._16_4_;
            auVar147._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar130._20_4_;
            auVar147._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar130._24_4_;
            auVar147._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar130._28_4_;
            auVar130 = vblendmps_avx512vl(ZEXT1632(auVar112),ZEXT1632(auVar32));
            auVar148._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar130._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar245._0_4_);
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar148._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar245._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar148._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar245._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar148._12_4_ =
                 (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar245._12_4_);
            fVar204 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar130._16_4_);
            auVar148._16_4_ = fVar204;
            fVar196 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar130._20_4_);
            auVar148._20_4_ = fVar196;
            fVar214 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar130._24_4_);
            auVar148._24_4_ = fVar214;
            auVar148._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar130._28_4_;
            auVar130 = vblendmps_avx512vl(ZEXT1632(auVar41),ZEXT1632(auVar33));
            auVar149._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar130._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar31._0_4_);
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar149._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar31._4_4_);
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar149._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar31._8_4_);
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar149._12_4_ =
                 (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar31._12_4_);
            fVar156 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar130._16_4_);
            auVar149._16_4_ = fVar156;
            fVar106 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar130._20_4_);
            auVar149._20_4_ = fVar106;
            fVar105 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar130._24_4_);
            auVar149._24_4_ = fVar105;
            iVar2 = (uint)(byte)(uVar97 >> 7) * auVar130._28_4_;
            auVar149._28_4_ = iVar2;
            auVar150._0_4_ =
                 (uint)(bVar104 & 1) * (int)auVar36._0_4_ |
                 (uint)!(bool)(bVar104 & 1) * auVar126._0_4_;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar16 * (int)auVar36._4_4_ | (uint)!bVar16 * auVar126._4_4_;
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar16 * (int)auVar36._8_4_ | (uint)!bVar16 * auVar126._8_4_;
            bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar16 * (int)auVar36._12_4_ | (uint)!bVar16 * auVar126._12_4_;
            auVar150._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar126._16_4_;
            auVar150._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar126._20_4_;
            auVar150._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar126._24_4_;
            auVar150._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar126._28_4_;
            bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar126 = vsubps_avx512vl(auVar150,auVar117);
            auVar132 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar112._12_4_ |
                                                     (uint)!bVar20 * auVar32._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar112._8_4_ |
                                                              (uint)!bVar18 * auVar32._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar112._4_4_ |
                                                                       (uint)!bVar16 * auVar32._4_4_
                                                                       ,(uint)(bVar104 & 1) *
                                                                        (int)auVar112._0_4_ |
                                                                        (uint)!(bool)(bVar104 & 1) *
                                                                        auVar32._0_4_)))),auVar120);
            auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar41._12_4_ |
                                                     (uint)!bVar21 * auVar33._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar41._8_4_ |
                                                              (uint)!bVar19 * auVar33._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar41._4_4_ |
                                                                       (uint)!bVar17 * auVar33._4_4_
                                                                       ,(uint)(bVar104 & 1) *
                                                                        (int)auVar41._0_4_ |
                                                                        (uint)!(bool)(bVar104 & 1) *
                                                                        auVar33._0_4_)))),auVar146);
            auVar127 = vsubps_avx(auVar117,auVar147);
            auVar115 = vsubps_avx(auVar120,auVar148);
            auVar116 = vsubps_avx(auVar146,auVar149);
            auVar70._4_4_ = auVar128._4_4_ * fVar159;
            auVar70._0_4_ = auVar128._0_4_ * fVar157;
            auVar70._8_4_ = auVar128._8_4_ * fVar162;
            auVar70._12_4_ = auVar128._12_4_ * fVar163;
            auVar70._16_4_ = auVar128._16_4_ * 0.0;
            auVar70._20_4_ = auVar128._20_4_ * 0.0;
            auVar70._24_4_ = auVar128._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar70,auVar146,auVar126);
            auVar203._0_4_ = fVar158 * auVar126._0_4_;
            auVar203._4_4_ = fVar161 * auVar126._4_4_;
            auVar203._8_4_ = fVar160 * auVar126._8_4_;
            auVar203._12_4_ = fVar164 * auVar126._12_4_;
            auVar203._16_4_ = auVar126._16_4_ * 0.0;
            auVar203._20_4_ = auVar126._20_4_ * 0.0;
            auVar203._24_4_ = auVar126._24_4_ * 0.0;
            auVar203._28_4_ = 0;
            auVar245 = vfmsub231ps_fma(auVar203,auVar117,auVar132);
            auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar245),auVar124,ZEXT1632(auVar111));
            auVar210._0_4_ = auVar132._0_4_ * auVar146._0_4_;
            auVar210._4_4_ = auVar132._4_4_ * auVar146._4_4_;
            auVar210._8_4_ = auVar132._8_4_ * auVar146._8_4_;
            auVar210._12_4_ = auVar132._12_4_ * auVar146._12_4_;
            auVar210._16_4_ = auVar132._16_4_ * fVar205;
            auVar210._20_4_ = auVar132._20_4_ * fVar213;
            auVar210._24_4_ = auVar132._24_4_ * fVar212;
            auVar210._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar210,auVar120,auVar128);
            auVar118 = vfmadd231ps_avx512vl(auVar130,auVar124,ZEXT1632(auVar111));
            auVar130 = vmulps_avx512vl(auVar116,auVar147);
            auVar130 = vfmsub231ps_avx512vl(auVar130,auVar127,auVar149);
            auVar71._4_4_ = auVar115._4_4_ * auVar149._4_4_;
            auVar71._0_4_ = auVar115._0_4_ * auVar149._0_4_;
            auVar71._8_4_ = auVar115._8_4_ * auVar149._8_4_;
            auVar71._12_4_ = auVar115._12_4_ * auVar149._12_4_;
            auVar71._16_4_ = auVar115._16_4_ * fVar156;
            auVar71._20_4_ = auVar115._20_4_ * fVar106;
            auVar71._24_4_ = auVar115._24_4_ * fVar105;
            auVar71._28_4_ = iVar2;
            auVar111 = vfmsub231ps_fma(auVar71,auVar148,auVar116);
            auVar211._0_4_ = auVar148._0_4_ * auVar127._0_4_;
            auVar211._4_4_ = auVar148._4_4_ * auVar127._4_4_;
            auVar211._8_4_ = auVar148._8_4_ * auVar127._8_4_;
            auVar211._12_4_ = auVar148._12_4_ * auVar127._12_4_;
            auVar211._16_4_ = fVar204 * auVar127._16_4_;
            auVar211._20_4_ = fVar196 * auVar127._20_4_;
            auVar211._24_4_ = fVar214 * auVar127._24_4_;
            auVar211._28_4_ = 0;
            auVar245 = vfmsub231ps_fma(auVar211,auVar115,auVar147);
            auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar245),auVar124,auVar130);
            auVar119 = vfmadd231ps_avx512vl(auVar130,auVar124,ZEXT1632(auVar111));
            auVar130 = vmaxps_avx(auVar118,auVar119);
            uVar166 = vcmpps_avx512vl(auVar130,auVar124,2);
            local_5f0 = local_5f0 & (byte)uVar166;
            if (local_5f0 == 0) {
LAB_01c8b25a:
              local_5f0 = 0;
            }
            else {
              auVar72._4_4_ = auVar116._4_4_ * auVar132._4_4_;
              auVar72._0_4_ = auVar116._0_4_ * auVar132._0_4_;
              auVar72._8_4_ = auVar116._8_4_ * auVar132._8_4_;
              auVar72._12_4_ = auVar116._12_4_ * auVar132._12_4_;
              auVar72._16_4_ = auVar116._16_4_ * auVar132._16_4_;
              auVar72._20_4_ = auVar116._20_4_ * auVar132._20_4_;
              auVar72._24_4_ = auVar116._24_4_ * auVar132._24_4_;
              auVar72._28_4_ = auVar130._28_4_;
              auVar31 = vfmsub231ps_fma(auVar72,auVar115,auVar128);
              auVar73._4_4_ = auVar128._4_4_ * auVar127._4_4_;
              auVar73._0_4_ = auVar128._0_4_ * auVar127._0_4_;
              auVar73._8_4_ = auVar128._8_4_ * auVar127._8_4_;
              auVar73._12_4_ = auVar128._12_4_ * auVar127._12_4_;
              auVar73._16_4_ = auVar128._16_4_ * auVar127._16_4_;
              auVar73._20_4_ = auVar128._20_4_ * auVar127._20_4_;
              auVar73._24_4_ = auVar128._24_4_ * auVar127._24_4_;
              auVar73._28_4_ = auVar128._28_4_;
              auVar245 = vfmsub231ps_fma(auVar73,auVar126,auVar116);
              auVar74._4_4_ = auVar115._4_4_ * auVar126._4_4_;
              auVar74._0_4_ = auVar115._0_4_ * auVar126._0_4_;
              auVar74._8_4_ = auVar115._8_4_ * auVar126._8_4_;
              auVar74._12_4_ = auVar115._12_4_ * auVar126._12_4_;
              auVar74._16_4_ = auVar115._16_4_ * auVar126._16_4_;
              auVar74._20_4_ = auVar115._20_4_ * auVar126._20_4_;
              auVar74._24_4_ = auVar115._24_4_ * auVar126._24_4_;
              auVar74._28_4_ = auVar115._28_4_;
              auVar32 = vfmsub231ps_fma(auVar74,auVar127,auVar132);
              auVar111 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar245),ZEXT1632(auVar32));
              auVar130 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar31),auVar124);
              auVar132 = vrcp14ps_avx512vl(auVar130);
              auVar47._8_4_ = 0x3f800000;
              auVar47._0_8_ = &DAT_3f8000003f800000;
              auVar47._12_4_ = 0x3f800000;
              auVar47._16_4_ = 0x3f800000;
              auVar47._20_4_ = 0x3f800000;
              auVar47._24_4_ = 0x3f800000;
              auVar47._28_4_ = 0x3f800000;
              auVar128 = vfnmadd213ps_avx512vl(auVar132,auVar130,auVar47);
              auVar111 = vfmadd132ps_fma(auVar128,auVar132,auVar132);
              auVar75._4_4_ = auVar32._4_4_ * auVar146._4_4_;
              auVar75._0_4_ = auVar32._0_4_ * auVar146._0_4_;
              auVar75._8_4_ = auVar32._8_4_ * auVar146._8_4_;
              auVar75._12_4_ = auVar32._12_4_ * auVar146._12_4_;
              auVar75._16_4_ = fVar205 * 0.0;
              auVar75._20_4_ = fVar213 * 0.0;
              auVar75._24_4_ = fVar212 * 0.0;
              auVar75._28_4_ = iVar1;
              auVar245 = vfmadd231ps_fma(auVar75,auVar120,ZEXT1632(auVar245));
              auVar245 = vfmadd231ps_fma(ZEXT1632(auVar245),auVar117,ZEXT1632(auVar31));
              fVar205 = auVar111._0_4_;
              fVar212 = auVar111._4_4_;
              fVar213 = auVar111._8_4_;
              fVar214 = auVar111._12_4_;
              auVar132 = ZEXT1632(CONCAT412(auVar245._12_4_ * fVar214,
                                            CONCAT48(auVar245._8_4_ * fVar213,
                                                     CONCAT44(auVar245._4_4_ * fVar212,
                                                              auVar245._0_4_ * fVar205))));
              auVar94._4_4_ = uStack_6bc;
              auVar94._0_4_ = local_6c0;
              auVar94._8_4_ = uStack_6b8;
              auVar94._12_4_ = uStack_6b4;
              auVar94._16_4_ = uStack_6b0;
              auVar94._20_4_ = uStack_6ac;
              auVar94._24_4_ = uStack_6a8;
              auVar94._28_4_ = uStack_6a4;
              uVar166 = vcmpps_avx512vl(auVar132,auVar94,0xd);
              uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar48._4_4_ = uVar165;
              auVar48._0_4_ = uVar165;
              auVar48._8_4_ = uVar165;
              auVar48._12_4_ = uVar165;
              auVar48._16_4_ = uVar165;
              auVar48._20_4_ = uVar165;
              auVar48._24_4_ = uVar165;
              auVar48._28_4_ = uVar165;
              uVar37 = vcmpps_avx512vl(auVar132,auVar48,2);
              local_5f0 = (byte)uVar166 & (byte)uVar37 & local_5f0;
              if (local_5f0 == 0) goto LAB_01c8b25a;
              uVar166 = vcmpps_avx512vl(auVar130,auVar124,4);
              if ((local_5f0 & (byte)uVar166) == 0) {
                local_5f0 = 0;
              }
              else {
                local_5f0 = local_5f0 & (byte)uVar166;
                fVar196 = auVar118._0_4_ * fVar205;
                fVar204 = auVar118._4_4_ * fVar212;
                auVar76._4_4_ = fVar204;
                auVar76._0_4_ = fVar196;
                fVar105 = auVar118._8_4_ * fVar213;
                auVar76._8_4_ = fVar105;
                fVar106 = auVar118._12_4_ * fVar214;
                auVar76._12_4_ = fVar106;
                fVar156 = auVar118._16_4_ * 0.0;
                auVar76._16_4_ = fVar156;
                fVar157 = auVar118._20_4_ * 0.0;
                auVar76._20_4_ = fVar157;
                fVar158 = auVar118._24_4_ * 0.0;
                auVar76._24_4_ = fVar158;
                auVar76._28_4_ = auVar118._28_4_;
                fVar205 = auVar119._0_4_ * fVar205;
                fVar212 = auVar119._4_4_ * fVar212;
                auVar77._4_4_ = fVar212;
                auVar77._0_4_ = fVar205;
                fVar213 = auVar119._8_4_ * fVar213;
                auVar77._8_4_ = fVar213;
                fVar214 = auVar119._12_4_ * fVar214;
                auVar77._12_4_ = fVar214;
                fVar159 = auVar119._16_4_ * 0.0;
                auVar77._16_4_ = fVar159;
                fVar161 = auVar119._20_4_ * 0.0;
                auVar77._20_4_ = fVar161;
                fVar162 = auVar119._24_4_ * 0.0;
                auVar77._24_4_ = fVar162;
                auVar77._28_4_ = auVar119._28_4_;
                auVar223._8_4_ = 0x3f800000;
                auVar223._0_8_ = &DAT_3f8000003f800000;
                auVar223._12_4_ = 0x3f800000;
                auVar223._16_4_ = 0x3f800000;
                auVar223._20_4_ = 0x3f800000;
                auVar223._24_4_ = 0x3f800000;
                auVar223._28_4_ = 0x3f800000;
                auVar130 = vsubps_avx(auVar223,auVar76);
                local_8a0._0_4_ =
                     (uint)(bVar104 & 1) * (int)fVar196 |
                     (uint)!(bool)(bVar104 & 1) * auVar130._0_4_;
                bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                local_8a0._4_4_ = (uint)bVar16 * (int)fVar204 | (uint)!bVar16 * auVar130._4_4_;
                bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
                local_8a0._8_4_ = (uint)bVar16 * (int)fVar105 | (uint)!bVar16 * auVar130._8_4_;
                bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
                local_8a0._12_4_ = (uint)bVar16 * (int)fVar106 | (uint)!bVar16 * auVar130._12_4_;
                bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
                local_8a0._16_4_ = (uint)bVar16 * (int)fVar156 | (uint)!bVar16 * auVar130._16_4_;
                bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
                local_8a0._20_4_ = (uint)bVar16 * (int)fVar157 | (uint)!bVar16 * auVar130._20_4_;
                bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
                local_8a0._24_4_ = (uint)bVar16 * (int)fVar158 | (uint)!bVar16 * auVar130._24_4_;
                bVar16 = SUB81(uVar97 >> 7,0);
                local_8a0._28_4_ = (uint)bVar16 * auVar118._28_4_ | (uint)!bVar16 * auVar130._28_4_;
                auVar130 = vsubps_avx(auVar223,auVar77);
                local_500._0_4_ =
                     (uint)(bVar104 & 1) * (int)fVar205 |
                     (uint)!(bool)(bVar104 & 1) * auVar130._0_4_;
                bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                local_500._4_4_ = (uint)bVar16 * (int)fVar212 | (uint)!bVar16 * auVar130._4_4_;
                bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
                local_500._8_4_ = (uint)bVar16 * (int)fVar213 | (uint)!bVar16 * auVar130._8_4_;
                bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
                local_500._12_4_ = (uint)bVar16 * (int)fVar214 | (uint)!bVar16 * auVar130._12_4_;
                bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
                local_500._16_4_ = (uint)bVar16 * (int)fVar159 | (uint)!bVar16 * auVar130._16_4_;
                bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
                local_500._20_4_ = (uint)bVar16 * (int)fVar161 | (uint)!bVar16 * auVar130._20_4_;
                bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
                local_500._24_4_ = (uint)bVar16 * (int)fVar162 | (uint)!bVar16 * auVar130._24_4_;
                bVar16 = SUB81(uVar97 >> 7,0);
                local_500._28_4_ = (uint)bVar16 * auVar119._28_4_ | (uint)!bVar16 * auVar130._28_4_;
                local_8c0 = auVar132;
              }
            }
            auVar242 = ZEXT3264(local_6e0);
            if (local_5f0 != 0) {
              auVar130 = vsubps_avx(ZEXT1632(auVar110),auVar121);
              auVar111 = vfmadd213ps_fma(auVar130,local_8a0,auVar121);
              uVar165 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar49._4_4_ = uVar165;
              auVar49._0_4_ = uVar165;
              auVar49._8_4_ = uVar165;
              auVar49._12_4_ = uVar165;
              auVar49._16_4_ = uVar165;
              auVar49._20_4_ = uVar165;
              auVar49._24_4_ = uVar165;
              auVar49._28_4_ = uVar165;
              auVar130 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar111._12_4_ + auVar111._12_4_,
                                                            CONCAT48(auVar111._8_4_ + auVar111._8_4_
                                                                     ,CONCAT44(auVar111._4_4_ +
                                                                               auVar111._4_4_,
                                                                               auVar111._0_4_ +
                                                                               auVar111._0_4_)))),
                                         auVar49);
              uVar166 = vcmpps_avx512vl(local_8c0,auVar130,6);
              local_5f0 = local_5f0 & (byte)uVar166;
              if (local_5f0 != 0) {
                auVar177._8_4_ = 0xbf800000;
                auVar177._0_8_ = 0xbf800000bf800000;
                auVar177._12_4_ = 0xbf800000;
                auVar177._16_4_ = 0xbf800000;
                auVar177._20_4_ = 0xbf800000;
                auVar177._24_4_ = 0xbf800000;
                auVar177._28_4_ = 0xbf800000;
                auVar50._8_4_ = 0x40000000;
                auVar50._0_8_ = 0x4000000040000000;
                auVar50._12_4_ = 0x40000000;
                auVar50._16_4_ = 0x40000000;
                auVar50._20_4_ = 0x40000000;
                auVar50._24_4_ = 0x40000000;
                auVar50._28_4_ = 0x40000000;
                local_680 = vfmadd132ps_avx512vl(local_500,auVar177,auVar50);
                local_500 = local_680;
                auVar130 = local_500;
                local_640 = (undefined4)lVar100;
                local_630 = local_960;
                uStack_628 = uStack_958;
                local_620 = local_8e0._0_8_;
                uStack_618 = local_8e0._8_8_;
                local_610 = local_8f0._0_8_;
                uStack_608 = local_8f0._8_8_;
                local_600 = local_8d0;
                uStack_5f8 = uStack_8c8;
                pGVar11 = (context->scene->geometries).items[uVar7].ptr;
                local_500 = auVar130;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar111 = vcvtsi2ss_avx512f(auVar243._0_16_,local_640);
                  fVar205 = auVar111._0_4_;
                  local_5e0[0] = (fVar205 + local_8a0._0_4_ + 0.0) * local_520;
                  local_5e0[1] = (fVar205 + local_8a0._4_4_ + 1.0) * fStack_51c;
                  local_5e0[2] = (fVar205 + local_8a0._8_4_ + 2.0) * fStack_518;
                  local_5e0[3] = (fVar205 + local_8a0._12_4_ + 3.0) * fStack_514;
                  fStack_5d0 = (fVar205 + local_8a0._16_4_ + 4.0) * fStack_510;
                  fStack_5cc = (fVar205 + local_8a0._20_4_ + 5.0) * fStack_50c;
                  fStack_5c8 = (fVar205 + local_8a0._24_4_ + 6.0) * fStack_508;
                  fStack_5c4 = fVar205 + local_8a0._28_4_ + 7.0;
                  local_500._0_8_ = local_680._0_8_;
                  local_500._8_8_ = local_680._8_8_;
                  local_500._16_8_ = local_680._16_8_;
                  local_500._24_8_ = local_680._24_8_;
                  local_5c0 = local_500._0_8_;
                  uStack_5b8 = local_500._8_8_;
                  uStack_5b0 = local_500._16_8_;
                  uStack_5a8 = local_500._24_8_;
                  local_5a0 = local_8c0;
                  auVar178._8_4_ = 0x7f800000;
                  auVar178._0_8_ = 0x7f8000007f800000;
                  auVar178._12_4_ = 0x7f800000;
                  auVar178._16_4_ = 0x7f800000;
                  auVar178._20_4_ = 0x7f800000;
                  auVar178._24_4_ = 0x7f800000;
                  auVar178._28_4_ = 0x7f800000;
                  auVar130 = vblendmps_avx512vl(auVar178,local_8c0);
                  auVar151._0_4_ =
                       (uint)(local_5f0 & 1) * auVar130._0_4_ |
                       (uint)!(bool)(local_5f0 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 1 & 1);
                  auVar151._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 2 & 1);
                  auVar151._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 3 & 1);
                  auVar151._12_4_ = (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 4 & 1);
                  auVar151._16_4_ = (uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 5 & 1);
                  auVar151._20_4_ = (uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_5f0 >> 6 & 1);
                  auVar151._24_4_ = (uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar151._28_4_ =
                       (uint)(local_5f0 >> 7) * auVar130._28_4_ |
                       (uint)!(bool)(local_5f0 >> 7) * 0x7f800000;
                  auVar130 = vshufps_avx(auVar151,auVar151,0xb1);
                  auVar130 = vminps_avx(auVar151,auVar130);
                  auVar132 = vshufpd_avx(auVar130,auVar130,5);
                  auVar130 = vminps_avx(auVar130,auVar132);
                  auVar132 = vpermpd_avx2(auVar130,0x4e);
                  auVar130 = vminps_avx(auVar130,auVar132);
                  uVar166 = vcmpps_avx512vl(auVar151,auVar130,0);
                  bVar96 = (byte)uVar166 & local_5f0;
                  bVar104 = local_5f0;
                  if (bVar96 != 0) {
                    bVar104 = bVar96;
                  }
                  uVar101 = 0;
                  for (uVar99 = (uint)bVar104; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000)
                  {
                    uVar101 = uVar101 + 1;
                  }
                  uVar97 = (ulong)uVar101;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar205 = local_5e0[uVar97];
                    uVar165 = *(undefined4 *)((long)&local_5c0 + uVar97 * 4);
                    fVar213 = 1.0 - fVar205;
                    fVar212 = fVar213 * fVar213 * -3.0;
                    auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                               ZEXT416((uint)(fVar205 * fVar213)),
                                               ZEXT416(0xc0000000));
                    auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar213)),
                                               ZEXT416((uint)(fVar205 * fVar205)),
                                               ZEXT416(0x40000000));
                    fVar213 = auVar111._0_4_ * 3.0;
                    fVar214 = auVar110._0_4_ * 3.0;
                    fVar196 = fVar205 * fVar205 * 3.0;
                    auVar219._0_4_ = fVar196 * (float)local_8d0._0_4_;
                    auVar219._4_4_ = fVar196 * (float)local_8d0._4_4_;
                    auVar219._8_4_ = fVar196 * (float)uStack_8c8;
                    auVar219._12_4_ = fVar196 * uStack_8c8._4_4_;
                    auVar194._4_4_ = fVar214;
                    auVar194._0_4_ = fVar214;
                    auVar194._8_4_ = fVar214;
                    auVar194._12_4_ = fVar214;
                    auVar111 = vfmadd132ps_fma(auVar194,auVar219,local_8f0);
                    auVar200._4_4_ = fVar213;
                    auVar200._0_4_ = fVar213;
                    auVar200._8_4_ = fVar213;
                    auVar200._12_4_ = fVar213;
                    auVar111 = vfmadd132ps_fma(auVar200,auVar111,local_8e0);
                    auVar195._4_4_ = fVar212;
                    auVar195._0_4_ = fVar212;
                    auVar195._8_4_ = fVar212;
                    auVar195._12_4_ = fVar212;
                    auVar111 = vfmadd132ps_fma(auVar195,auVar111,auVar30);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar111._0_4_;
                    uVar10 = vextractps_avx(auVar111,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar111,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar205;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar165;
                    *(uint *)(ray + k * 4 + 0x440) = uVar8;
                    *(uint *)(ray + k * 4 + 0x480) = uVar7;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_830 = local_8e0._0_4_;
                    fStack_82c = local_8e0._4_4_;
                    fStack_828 = local_8e0._8_4_;
                    fStack_824 = local_8e0._12_4_;
                    local_910 = local_8f0;
                    local_4c0 = local_8d0;
                    uStack_4b8 = uStack_8c8;
                    local_4a0 = vmovdqa64_avx512vl(auVar243._0_32_);
                    local_6a0 = local_8a0;
                    local_660 = local_8c0;
                    local_63c = iVar9;
                    bVar104 = local_5f0;
                    do {
                      auVar245 = auVar246._0_16_;
                      local_820 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar97]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_5c0 + uVar97 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4)
                      ;
                      local_948.context = context->user;
                      fVar214 = local_200._0_4_;
                      fVar212 = 1.0 - fVar214;
                      fVar205 = fVar212 * fVar212 * -3.0;
                      auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar212)),
                                                 ZEXT416((uint)(fVar214 * fVar212)),
                                                 ZEXT416(0xc0000000));
                      auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar214 * fVar212)),
                                                 ZEXT416((uint)(fVar214 * fVar214)),
                                                 ZEXT416(0x40000000));
                      fVar212 = auVar111._0_4_ * 3.0;
                      fVar213 = auVar110._0_4_ * 3.0;
                      fVar214 = fVar214 * fVar214 * 3.0;
                      auVar220._0_4_ = fVar214 * (float)local_4c0;
                      auVar220._4_4_ = fVar214 * local_4c0._4_4_;
                      auVar220._8_4_ = fVar214 * (float)uStack_4b8;
                      auVar220._12_4_ = fVar214 * uStack_4b8._4_4_;
                      auVar171._4_4_ = fVar213;
                      auVar171._0_4_ = fVar213;
                      auVar171._8_4_ = fVar213;
                      auVar171._12_4_ = fVar213;
                      auVar111 = vfmadd132ps_fma(auVar171,auVar220,local_910);
                      auVar201._4_4_ = fVar212;
                      auVar201._0_4_ = fVar212;
                      auVar201._8_4_ = fVar212;
                      auVar201._12_4_ = fVar212;
                      auVar92._4_4_ = fStack_82c;
                      auVar92._0_4_ = local_830;
                      auVar92._8_4_ = fStack_828;
                      auVar92._12_4_ = fStack_824;
                      auVar111 = vfmadd132ps_fma(auVar201,auVar111,auVar92);
                      auVar172._4_4_ = fVar205;
                      auVar172._0_4_ = fVar205;
                      auVar172._8_4_ = fVar205;
                      auVar172._12_4_ = fVar205;
                      auVar111 = vfmadd132ps_fma(auVar172,auVar111,auVar30);
                      auVar252 = vbroadcastss_avx512f(auVar111);
                      auVar154 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar154,ZEXT1664(auVar111));
                      auVar154 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar154,ZEXT1664(auVar111));
                      local_2c0[0] = (RTCHitN)auVar252[0];
                      local_2c0[1] = (RTCHitN)auVar252[1];
                      local_2c0[2] = (RTCHitN)auVar252[2];
                      local_2c0[3] = (RTCHitN)auVar252[3];
                      local_2c0[4] = (RTCHitN)auVar252[4];
                      local_2c0[5] = (RTCHitN)auVar252[5];
                      local_2c0[6] = (RTCHitN)auVar252[6];
                      local_2c0[7] = (RTCHitN)auVar252[7];
                      local_2c0[8] = (RTCHitN)auVar252[8];
                      local_2c0[9] = (RTCHitN)auVar252[9];
                      local_2c0[10] = (RTCHitN)auVar252[10];
                      local_2c0[0xb] = (RTCHitN)auVar252[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar252[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar252[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar252[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar252[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar252[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar252[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar252[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar252[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar252[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar252[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar252[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar252[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar252[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar252[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar252[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar252[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar252[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar252[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar252[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar252[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar252[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar252[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar252[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar252[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar252[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar252[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar252[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar252[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar252[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar252[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar252[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar252[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar252[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar252[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar252[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar252[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar252[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar252[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar252[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar252[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar252[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar252[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar252[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar252[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar252[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar252[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar252[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar252[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar252[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar252[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar252[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar252[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar252 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar252);
                      auVar130 = vpcmpeqd_avx2(auVar252._0_32_,auVar252._0_32_);
                      local_918[3] = auVar130;
                      local_918[2] = auVar130;
                      local_918[1] = auVar130;
                      *local_918 = auVar130;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_948.context)->instPrimID[0]));
                      local_580 = local_300;
                      local_948.valid = (int *)local_580;
                      local_948.geometryUserPtr = pGVar11->userPtr;
                      local_948.hit = local_2c0;
                      local_948.N = 0x10;
                      local_900 = (uint)bVar104;
                      local_948.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_948);
                        auVar130 = vmovdqa64_avx512vl(local_4a0);
                        auVar243 = ZEXT3264(auVar130);
                        auVar251 = ZEXT3264(local_740);
                        auVar181 = ZEXT3264(local_720);
                        auVar250 = ZEXT3264(local_7c0);
                        auVar249 = ZEXT3264(local_7a0);
                        auVar248 = ZEXT3264(local_700);
                        auVar247 = ZEXT3264(local_780);
                        auVar242 = ZEXT3264(local_6e0);
                        auVar244 = ZEXT3264(local_760);
                        auVar111 = vxorps_avx512vl(auVar245,auVar245);
                        auVar246 = ZEXT1664(auVar111);
                      }
                      bVar96 = (byte)local_900;
                      auVar111 = auVar246._0_16_;
                      auVar252 = vmovdqa64_avx512f(local_580);
                      uVar166 = vptestmd_avx512f(auVar252,auVar252);
                      if ((short)uVar166 == 0) {
LAB_01c8b6db:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_820;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_948);
                          bVar96 = (byte)local_900;
                          auVar130 = vmovdqa64_avx512vl(local_4a0);
                          auVar243 = ZEXT3264(auVar130);
                          auVar251 = ZEXT3264(local_740);
                          auVar181 = ZEXT3264(local_720);
                          auVar250 = ZEXT3264(local_7c0);
                          auVar249 = ZEXT3264(local_7a0);
                          auVar248 = ZEXT3264(local_700);
                          auVar247 = ZEXT3264(local_780);
                          auVar242 = ZEXT3264(local_6e0);
                          auVar244 = ZEXT3264(local_760);
                          auVar111 = vxorps_avx512vl(auVar111,auVar111);
                          auVar246 = ZEXT1664(auVar111);
                        }
                        auVar252 = vmovdqa64_avx512f(local_580);
                        uVar38 = vptestmd_avx512f(auVar252,auVar252);
                        if ((short)uVar38 == 0) goto LAB_01c8b6db;
                        iVar1 = *(int *)(local_948.hit + 4);
                        iVar2 = *(int *)(local_948.hit + 8);
                        iVar78 = *(int *)(local_948.hit + 0xc);
                        iVar79 = *(int *)(local_948.hit + 0x10);
                        iVar80 = *(int *)(local_948.hit + 0x14);
                        iVar81 = *(int *)(local_948.hit + 0x18);
                        iVar82 = *(int *)(local_948.hit + 0x1c);
                        iVar83 = *(int *)(local_948.hit + 0x20);
                        iVar84 = *(int *)(local_948.hit + 0x24);
                        iVar85 = *(int *)(local_948.hit + 0x28);
                        iVar86 = *(int *)(local_948.hit + 0x2c);
                        iVar87 = *(int *)(local_948.hit + 0x30);
                        iVar88 = *(int *)(local_948.hit + 0x34);
                        iVar89 = *(int *)(local_948.hit + 0x38);
                        iVar90 = *(int *)(local_948.hit + 0x3c);
                        bVar104 = (byte)uVar38;
                        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                        bVar95 = (byte)(uVar38 >> 8);
                        bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                        bVar29 = SUB81(uVar38 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x300) =
                             (uint)(bVar104 & 1) * *(int *)local_948.hit |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_948.ray + 0x300);
                        *(uint *)(local_948.ray + 0x304) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x304);
                        *(uint *)(local_948.ray + 0x308) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x308);
                        *(uint *)(local_948.ray + 0x30c) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x30c)
                        ;
                        *(uint *)(local_948.ray + 0x310) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x310)
                        ;
                        *(uint *)(local_948.ray + 0x314) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x314)
                        ;
                        *(uint *)(local_948.ray + 0x318) =
                             (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x318)
                        ;
                        *(uint *)(local_948.ray + 0x31c) =
                             (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x31c)
                        ;
                        *(uint *)(local_948.ray + 800) =
                             (uint)(bVar95 & 1) * iVar83 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 800);
                        *(uint *)(local_948.ray + 0x324) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x324)
                        ;
                        *(uint *)(local_948.ray + 0x328) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x328)
                        ;
                        *(uint *)(local_948.ray + 0x32c) =
                             (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x32c)
                        ;
                        *(uint *)(local_948.ray + 0x330) =
                             (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x330)
                        ;
                        *(uint *)(local_948.ray + 0x334) =
                             (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x334)
                        ;
                        *(uint *)(local_948.ray + 0x338) =
                             (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x338)
                        ;
                        *(uint *)(local_948.ray + 0x33c) =
                             (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_948.hit + 0x44);
                        iVar2 = *(int *)(local_948.hit + 0x48);
                        iVar78 = *(int *)(local_948.hit + 0x4c);
                        iVar79 = *(int *)(local_948.hit + 0x50);
                        iVar80 = *(int *)(local_948.hit + 0x54);
                        iVar81 = *(int *)(local_948.hit + 0x58);
                        iVar82 = *(int *)(local_948.hit + 0x5c);
                        iVar83 = *(int *)(local_948.hit + 0x60);
                        iVar84 = *(int *)(local_948.hit + 100);
                        iVar85 = *(int *)(local_948.hit + 0x68);
                        iVar86 = *(int *)(local_948.hit + 0x6c);
                        iVar87 = *(int *)(local_948.hit + 0x70);
                        iVar88 = *(int *)(local_948.hit + 0x74);
                        iVar89 = *(int *)(local_948.hit + 0x78);
                        iVar90 = *(int *)(local_948.hit + 0x7c);
                        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                        bVar29 = SUB81(uVar38 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x340) =
                             (uint)(bVar104 & 1) * *(int *)(local_948.hit + 0x40) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_948.ray + 0x340);
                        *(uint *)(local_948.ray + 0x344) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x344);
                        *(uint *)(local_948.ray + 0x348) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x348);
                        *(uint *)(local_948.ray + 0x34c) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x34c)
                        ;
                        *(uint *)(local_948.ray + 0x350) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x350)
                        ;
                        *(uint *)(local_948.ray + 0x354) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x354)
                        ;
                        *(uint *)(local_948.ray + 0x358) =
                             (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x358)
                        ;
                        *(uint *)(local_948.ray + 0x35c) =
                             (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x35c)
                        ;
                        *(uint *)(local_948.ray + 0x360) =
                             (uint)(bVar95 & 1) * iVar83 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x360);
                        *(uint *)(local_948.ray + 0x364) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x364)
                        ;
                        *(uint *)(local_948.ray + 0x368) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x368)
                        ;
                        *(uint *)(local_948.ray + 0x36c) =
                             (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x36c)
                        ;
                        *(uint *)(local_948.ray + 0x370) =
                             (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x370)
                        ;
                        *(uint *)(local_948.ray + 0x374) =
                             (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x374)
                        ;
                        *(uint *)(local_948.ray + 0x378) =
                             (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x378)
                        ;
                        *(uint *)(local_948.ray + 0x37c) =
                             (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_948.hit + 0x84);
                        iVar2 = *(int *)(local_948.hit + 0x88);
                        iVar78 = *(int *)(local_948.hit + 0x8c);
                        iVar79 = *(int *)(local_948.hit + 0x90);
                        iVar80 = *(int *)(local_948.hit + 0x94);
                        iVar81 = *(int *)(local_948.hit + 0x98);
                        iVar82 = *(int *)(local_948.hit + 0x9c);
                        iVar83 = *(int *)(local_948.hit + 0xa0);
                        iVar84 = *(int *)(local_948.hit + 0xa4);
                        iVar85 = *(int *)(local_948.hit + 0xa8);
                        iVar86 = *(int *)(local_948.hit + 0xac);
                        iVar87 = *(int *)(local_948.hit + 0xb0);
                        iVar88 = *(int *)(local_948.hit + 0xb4);
                        iVar89 = *(int *)(local_948.hit + 0xb8);
                        iVar90 = *(int *)(local_948.hit + 0xbc);
                        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                        bVar29 = SUB81(uVar38 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x380) =
                             (uint)(bVar104 & 1) * *(int *)(local_948.hit + 0x80) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_948.ray + 0x380);
                        *(uint *)(local_948.ray + 900) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 900);
                        *(uint *)(local_948.ray + 0x388) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x388);
                        *(uint *)(local_948.ray + 0x38c) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x38c)
                        ;
                        *(uint *)(local_948.ray + 0x390) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x390)
                        ;
                        *(uint *)(local_948.ray + 0x394) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x394)
                        ;
                        *(uint *)(local_948.ray + 0x398) =
                             (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x398)
                        ;
                        *(uint *)(local_948.ray + 0x39c) =
                             (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x39c)
                        ;
                        *(uint *)(local_948.ray + 0x3a0) =
                             (uint)(bVar95 & 1) * iVar83 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x3a0);
                        *(uint *)(local_948.ray + 0x3a4) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3a4)
                        ;
                        *(uint *)(local_948.ray + 0x3a8) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x3a8)
                        ;
                        *(uint *)(local_948.ray + 0x3ac) =
                             (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3ac)
                        ;
                        *(uint *)(local_948.ray + 0x3b0) =
                             (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3b0)
                        ;
                        *(uint *)(local_948.ray + 0x3b4) =
                             (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3b4)
                        ;
                        *(uint *)(local_948.ray + 0x3b8) =
                             (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3b8)
                        ;
                        *(uint *)(local_948.ray + 0x3bc) =
                             (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_948.hit + 0xc4);
                        iVar2 = *(int *)(local_948.hit + 200);
                        iVar78 = *(int *)(local_948.hit + 0xcc);
                        iVar79 = *(int *)(local_948.hit + 0xd0);
                        iVar80 = *(int *)(local_948.hit + 0xd4);
                        iVar81 = *(int *)(local_948.hit + 0xd8);
                        iVar82 = *(int *)(local_948.hit + 0xdc);
                        iVar83 = *(int *)(local_948.hit + 0xe0);
                        iVar84 = *(int *)(local_948.hit + 0xe4);
                        iVar85 = *(int *)(local_948.hit + 0xe8);
                        iVar86 = *(int *)(local_948.hit + 0xec);
                        iVar87 = *(int *)(local_948.hit + 0xf0);
                        iVar88 = *(int *)(local_948.hit + 0xf4);
                        iVar89 = *(int *)(local_948.hit + 0xf8);
                        iVar90 = *(int *)(local_948.hit + 0xfc);
                        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                        bVar29 = SUB81(uVar38 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x3c0) =
                             (uint)(bVar104 & 1) * *(int *)(local_948.hit + 0xc0) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_948.ray + 0x3c0);
                        *(uint *)(local_948.ray + 0x3c4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x3c4);
                        *(uint *)(local_948.ray + 0x3c8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x3c8);
                        *(uint *)(local_948.ray + 0x3cc) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x3cc)
                        ;
                        *(uint *)(local_948.ray + 0x3d0) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x3d0)
                        ;
                        *(uint *)(local_948.ray + 0x3d4) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x3d4)
                        ;
                        *(uint *)(local_948.ray + 0x3d8) =
                             (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x3d8)
                        ;
                        *(uint *)(local_948.ray + 0x3dc) =
                             (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x3dc)
                        ;
                        *(uint *)(local_948.ray + 0x3e0) =
                             (uint)(bVar95 & 1) * iVar83 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x3e0);
                        *(uint *)(local_948.ray + 0x3e4) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x3e4)
                        ;
                        *(uint *)(local_948.ray + 1000) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 1000);
                        *(uint *)(local_948.ray + 0x3ec) =
                             (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x3ec)
                        ;
                        *(uint *)(local_948.ray + 0x3f0) =
                             (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x3f0)
                        ;
                        *(uint *)(local_948.ray + 0x3f4) =
                             (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x3f4)
                        ;
                        *(uint *)(local_948.ray + 0x3f8) =
                             (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x3f8)
                        ;
                        *(uint *)(local_948.ray + 0x3fc) =
                             (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_948.hit + 0x104);
                        iVar2 = *(int *)(local_948.hit + 0x108);
                        iVar78 = *(int *)(local_948.hit + 0x10c);
                        iVar79 = *(int *)(local_948.hit + 0x110);
                        iVar80 = *(int *)(local_948.hit + 0x114);
                        iVar81 = *(int *)(local_948.hit + 0x118);
                        iVar82 = *(int *)(local_948.hit + 0x11c);
                        iVar83 = *(int *)(local_948.hit + 0x120);
                        iVar84 = *(int *)(local_948.hit + 0x124);
                        iVar85 = *(int *)(local_948.hit + 0x128);
                        iVar86 = *(int *)(local_948.hit + 300);
                        iVar87 = *(int *)(local_948.hit + 0x130);
                        iVar88 = *(int *)(local_948.hit + 0x134);
                        iVar89 = *(int *)(local_948.hit + 0x138);
                        iVar90 = *(int *)(local_948.hit + 0x13c);
                        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar38 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar38 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar38 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar38 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar38 >> 0xe) & 1);
                        bVar29 = SUB81(uVar38 >> 0xf,0);
                        *(uint *)(local_948.ray + 0x400) =
                             (uint)(bVar104 & 1) * *(int *)(local_948.hit + 0x100) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_948.ray + 0x400);
                        *(uint *)(local_948.ray + 0x404) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_948.ray + 0x404);
                        *(uint *)(local_948.ray + 0x408) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_948.ray + 0x408);
                        *(uint *)(local_948.ray + 0x40c) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_948.ray + 0x40c)
                        ;
                        *(uint *)(local_948.ray + 0x410) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_948.ray + 0x410)
                        ;
                        *(uint *)(local_948.ray + 0x414) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_948.ray + 0x414)
                        ;
                        *(uint *)(local_948.ray + 0x418) =
                             (uint)bVar21 * iVar81 | (uint)!bVar21 * *(int *)(local_948.ray + 0x418)
                        ;
                        *(uint *)(local_948.ray + 0x41c) =
                             (uint)bVar22 * iVar82 | (uint)!bVar22 * *(int *)(local_948.ray + 0x41c)
                        ;
                        *(uint *)(local_948.ray + 0x420) =
                             (uint)(bVar95 & 1) * iVar83 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_948.ray + 0x420);
                        *(uint *)(local_948.ray + 0x424) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_948.ray + 0x424)
                        ;
                        *(uint *)(local_948.ray + 0x428) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_948.ray + 0x428)
                        ;
                        *(uint *)(local_948.ray + 0x42c) =
                             (uint)bVar25 * iVar86 | (uint)!bVar25 * *(int *)(local_948.ray + 0x42c)
                        ;
                        *(uint *)(local_948.ray + 0x430) =
                             (uint)bVar26 * iVar87 | (uint)!bVar26 * *(int *)(local_948.ray + 0x430)
                        ;
                        *(uint *)(local_948.ray + 0x434) =
                             (uint)bVar27 * iVar88 | (uint)!bVar27 * *(int *)(local_948.ray + 0x434)
                        ;
                        *(uint *)(local_948.ray + 0x438) =
                             (uint)bVar28 * iVar89 | (uint)!bVar28 * *(int *)(local_948.ray + 0x438)
                        ;
                        *(uint *)(local_948.ray + 0x43c) =
                             (uint)bVar29 * iVar90 | (uint)!bVar29 * *(int *)(local_948.ray + 0x43c)
                        ;
                        auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x140));
                        auVar252 = vmovdqu32_avx512f(auVar252);
                        *(undefined1 (*) [64])(local_948.ray + 0x440) = auVar252;
                        auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x180));
                        auVar252 = vmovdqu32_avx512f(auVar252);
                        *(undefined1 (*) [64])(local_948.ray + 0x480) = auVar252;
                        auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x1c0));
                        auVar252 = vmovdqa32_avx512f(auVar252);
                        *(undefined1 (*) [64])(local_948.ray + 0x4c0) = auVar252;
                        auVar252 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_948.hit + 0x200));
                        auVar252 = vmovdqa32_avx512f(auVar252);
                        *(undefined1 (*) [64])(local_948.ray + 0x500) = auVar252;
                      }
                      bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar96;
                      uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar51._4_4_ = uVar165;
                      auVar51._0_4_ = uVar165;
                      auVar51._8_4_ = uVar165;
                      auVar51._12_4_ = uVar165;
                      auVar51._16_4_ = uVar165;
                      auVar51._20_4_ = uVar165;
                      auVar51._24_4_ = uVar165;
                      auVar51._28_4_ = uVar165;
                      uVar166 = vcmpps_avx512vl(local_8c0,auVar51,2);
                      bVar104 = bVar96 & (byte)uVar166;
                      if ((bVar96 & (byte)uVar166) != 0) {
                        auVar179._8_4_ = 0x7f800000;
                        auVar179._0_8_ = 0x7f8000007f800000;
                        auVar179._12_4_ = 0x7f800000;
                        auVar179._16_4_ = 0x7f800000;
                        auVar179._20_4_ = 0x7f800000;
                        auVar179._24_4_ = 0x7f800000;
                        auVar179._28_4_ = 0x7f800000;
                        auVar130 = vblendmps_avx512vl(auVar179,local_8c0);
                        auVar152._0_4_ =
                             (uint)(bVar104 & 1) * auVar130._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 1 & 1);
                        auVar152._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 2 & 1);
                        auVar152._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 3 & 1);
                        auVar152._12_4_ =
                             (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 4 & 1);
                        auVar152._16_4_ =
                             (uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 5 & 1);
                        auVar152._20_4_ =
                             (uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 6 & 1);
                        auVar152._24_4_ =
                             (uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar152._28_4_ =
                             (uint)(bVar104 >> 7) * auVar130._28_4_ |
                             (uint)!(bool)(bVar104 >> 7) * 0x7f800000;
                        auVar130 = vshufps_avx(auVar152,auVar152,0xb1);
                        auVar130 = vminps_avx(auVar152,auVar130);
                        auVar132 = vshufpd_avx(auVar130,auVar130,5);
                        auVar130 = vminps_avx(auVar130,auVar132);
                        auVar132 = vpermpd_avx2(auVar130,0x4e);
                        auVar130 = vminps_avx(auVar130,auVar132);
                        uVar166 = vcmpps_avx512vl(auVar152,auVar130,0);
                        bVar95 = (byte)uVar166 & bVar104;
                        bVar96 = bVar104;
                        if (bVar95 != 0) {
                          bVar96 = bVar95;
                        }
                        uVar101 = 0;
                        for (uVar99 = (uint)bVar96; (uVar99 & 1) == 0;
                            uVar99 = uVar99 >> 1 | 0x80000000) {
                          uVar101 = uVar101 + 1;
                        }
                        uVar97 = (ulong)uVar101;
                      }
                    } while (bVar104 != 0);
                  }
                }
              }
            }
          }
          lVar100 = lVar100 + 8;
        } while ((int)lVar100 < iVar9);
      }
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar43._4_4_ = uVar165;
      auVar43._0_4_ = uVar165;
      auVar43._8_4_ = uVar165;
      auVar43._12_4_ = uVar165;
      uVar166 = vcmpps_avx512vl(local_4b0,auVar43,2);
      uVar101 = (uint)uVar103 & (uint)uVar103 + 0xf & (uint)uVar166;
      uVar103 = (ulong)uVar101;
    } while (uVar101 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }